

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersector1<4>::
     intersect_h<embree::avx2::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  bool bVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [12];
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  uint uVar78;
  ulong uVar79;
  ulong uVar80;
  undefined4 uVar81;
  ulong uVar82;
  long lVar83;
  bool bVar84;
  float fVar85;
  vint4 bi_2;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 extraout_var [60];
  undefined1 auVar113 [64];
  undefined1 extraout_var_00 [60];
  float fVar114;
  float fVar146;
  float fVar147;
  vint4 bi_1;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  vint4 ai_2;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar204;
  float fVar205;
  vint4 ai;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar206;
  float fVar209;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar197 [16];
  undefined1 auVar202 [32];
  undefined1 auVar198 [28];
  float fVar207;
  float fVar208;
  undefined1 auVar203 [64];
  vint4 bi;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar219 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [28];
  float fVar232;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar234 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  float fVar247;
  vint4 ai_1;
  float fVar261;
  undefined1 auVar256 [32];
  undefined4 uVar277;
  undefined1 auVar272 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar248;
  float fVar249;
  undefined1 auVar246 [64];
  undefined1 auVar250 [16];
  undefined1 auVar252 [32];
  undefined1 auVar251 [16];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  float fVar259;
  float fVar260;
  undefined1 auVar255 [16];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined4 uVar276;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar281;
  float fVar282;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar280 [32];
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar287 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_aec;
  ulong local_ae8;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  ulong local_a78;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 auStack_9b0 [16];
  undefined8 local_990;
  float local_988;
  float local_984;
  undefined4 local_980;
  uint local_97c;
  uint local_978;
  uint local_974;
  uint local_970;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 auStack_8d0 [16];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [16];
  Primitive *local_790;
  ulong local_788;
  undefined4 local_780;
  undefined4 uStack_77c;
  undefined4 uStack_778;
  undefined4 uStack_774;
  undefined4 uStack_770;
  undefined4 uStack_76c;
  undefined4 uStack_768;
  undefined4 uStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined4 local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [32];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar4 = prim[1];
  uVar79 = (ulong)(byte)PVar4;
  fVar114 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar96 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  auVar86._0_4_ = fVar114 * auVar96._0_4_;
  auVar86._4_4_ = fVar114 * auVar96._4_4_;
  auVar86._8_4_ = fVar114 * auVar96._8_4_;
  auVar86._12_4_ = fVar114 * auVar96._12_4_;
  auVar210._0_4_ = fVar114 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar210._4_4_ = fVar114 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar210._8_4_ = fVar114 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar210._12_4_ = fVar114 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 4 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 5 + 6)));
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar218 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 6 + 6)));
  auVar218 = vcvtdq2ps_avx(auVar218);
  auVar124 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xb + 6)));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar272 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar79 + 6)));
  auVar272 = vcvtdq2ps_avx(auVar272);
  uVar82 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + uVar79 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  uVar82 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar155 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar278._4_4_ = auVar210._0_4_;
  auVar278._0_4_ = auVar210._0_4_;
  auVar278._8_4_ = auVar210._0_4_;
  auVar278._12_4_ = auVar210._0_4_;
  auVar116 = vshufps_avx(auVar210,auVar210,0x55);
  auVar87 = vshufps_avx(auVar210,auVar210,0xaa);
  fVar114 = auVar87._0_4_;
  auVar262._0_4_ = fVar114 * auVar218._0_4_;
  fVar85 = auVar87._4_4_;
  auVar262._4_4_ = fVar85 * auVar218._4_4_;
  fVar146 = auVar87._8_4_;
  auVar262._8_4_ = fVar146 * auVar218._8_4_;
  fVar247 = auVar87._12_4_;
  auVar262._12_4_ = fVar247 * auVar218._12_4_;
  auVar255._0_4_ = auVar272._0_4_ * fVar114;
  auVar255._4_4_ = auVar272._4_4_ * fVar85;
  auVar255._8_4_ = auVar272._8_4_ * fVar146;
  auVar255._12_4_ = auVar272._12_4_ * fVar247;
  auVar238._0_4_ = auVar155._0_4_ * fVar114;
  auVar238._4_4_ = auVar155._4_4_ * fVar85;
  auVar238._8_4_ = auVar155._8_4_ * fVar146;
  auVar238._12_4_ = auVar155._12_4_ * fVar247;
  auVar87 = vfmadd231ps_fma(auVar262,auVar116,auVar194);
  auVar117 = vfmadd231ps_fma(auVar255,auVar116,auVar9);
  auVar116 = vfmadd231ps_fma(auVar238,auVar88,auVar116);
  auVar167 = vfmadd231ps_fma(auVar87,auVar278,auVar96);
  auVar266 = ZEXT1664(auVar167);
  auVar117 = vfmadd231ps_fma(auVar117,auVar278,auVar124);
  auVar257 = ZEXT1664(auVar117);
  auVar192 = vfmadd231ps_fma(auVar116,auVar89,auVar278);
  auVar279._4_4_ = auVar86._0_4_;
  auVar279._0_4_ = auVar86._0_4_;
  auVar279._8_4_ = auVar86._0_4_;
  auVar279._12_4_ = auVar86._0_4_;
  auVar116 = vshufps_avx(auVar86,auVar86,0x55);
  auVar87 = vshufps_avx(auVar86,auVar86,0xaa);
  fVar114 = auVar87._0_4_;
  auVar211._0_4_ = fVar114 * auVar218._0_4_;
  fVar85 = auVar87._4_4_;
  auVar211._4_4_ = fVar85 * auVar218._4_4_;
  fVar146 = auVar87._8_4_;
  auVar211._8_4_ = fVar146 * auVar218._8_4_;
  fVar247 = auVar87._12_4_;
  auVar211._12_4_ = fVar247 * auVar218._12_4_;
  auVar115._0_4_ = auVar272._0_4_ * fVar114;
  auVar115._4_4_ = auVar272._4_4_ * fVar85;
  auVar115._8_4_ = auVar272._8_4_ * fVar146;
  auVar115._12_4_ = auVar272._12_4_ * fVar247;
  auVar87._0_4_ = auVar155._0_4_ * fVar114;
  auVar87._4_4_ = auVar155._4_4_ * fVar85;
  auVar87._8_4_ = auVar155._8_4_ * fVar146;
  auVar87._12_4_ = auVar155._12_4_ * fVar247;
  auVar194 = vfmadd231ps_fma(auVar211,auVar116,auVar194);
  auVar218 = vfmadd231ps_fma(auVar115,auVar116,auVar9);
  auVar9 = vfmadd231ps_fma(auVar87,auVar116,auVar88);
  auVar272 = vfmadd231ps_fma(auVar194,auVar279,auVar96);
  auVar88 = vfmadd231ps_fma(auVar218,auVar279,auVar124);
  auVar155 = vfmadd231ps_fma(auVar9,auVar279,auVar89);
  local_8b0._8_4_ = 0x7fffffff;
  local_8b0._0_8_ = 0x7fffffff7fffffff;
  local_8b0._12_4_ = 0x7fffffff;
  auVar96 = vandps_avx(auVar167,local_8b0);
  auVar191._8_4_ = 0x219392ef;
  auVar191._0_8_ = 0x219392ef219392ef;
  auVar191._12_4_ = 0x219392ef;
  auVar96 = vcmpps_avx(auVar96,auVar191,1);
  auVar194 = vblendvps_avx(auVar167,auVar191,auVar96);
  auVar96 = vandps_avx(auVar117,local_8b0);
  auVar96 = vcmpps_avx(auVar96,auVar191,1);
  auVar218 = vblendvps_avx(auVar117,auVar191,auVar96);
  auVar96 = vandps_avx(auVar192,local_8b0);
  auVar96 = vcmpps_avx(auVar96,auVar191,1);
  auVar96 = vblendvps_avx(auVar192,auVar191,auVar96);
  auVar124 = vrcpps_avx(auVar194);
  auVar233._8_4_ = 0x3f800000;
  auVar233._0_8_ = &DAT_3f8000003f800000;
  auVar233._12_4_ = 0x3f800000;
  auVar194 = vfnmadd213ps_fma(auVar194,auVar124,auVar233);
  auVar124 = vfmadd132ps_fma(auVar194,auVar124,auVar124);
  auVar194 = vrcpps_avx(auVar218);
  auVar218 = vfnmadd213ps_fma(auVar218,auVar194,auVar233);
  auVar9 = vfmadd132ps_fma(auVar218,auVar194,auVar194);
  auVar194 = vrcpps_avx(auVar96);
  auVar96 = vfnmadd213ps_fma(auVar96,auVar194,auVar233);
  auVar89 = vfmadd132ps_fma(auVar96,auVar194,auVar194);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar79 * 7 + 6);
  auVar96 = vpmovsxwd_avx(auVar96);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar272);
  auVar192._0_4_ = auVar124._0_4_ * auVar96._0_4_;
  auVar192._4_4_ = auVar124._4_4_ * auVar96._4_4_;
  auVar192._8_4_ = auVar124._8_4_ * auVar96._8_4_;
  auVar192._12_4_ = auVar124._12_4_ * auVar96._12_4_;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar79 * 9 + 6);
  auVar96 = vpmovsxwd_avx(auVar194);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar272);
  auVar212._0_4_ = auVar124._0_4_ * auVar96._0_4_;
  auVar212._4_4_ = auVar124._4_4_ * auVar96._4_4_;
  auVar212._8_4_ = auVar124._8_4_ * auVar96._8_4_;
  auVar212._12_4_ = auVar124._12_4_ * auVar96._12_4_;
  auVar117._1_3_ = 0;
  auVar117[0] = PVar4;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar194 = vpmovsxwd_avx(auVar218);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar79 * -2 + 6);
  auVar96 = vpmovsxwd_avx(auVar124);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar88);
  auVar239._0_4_ = auVar96._0_4_ * auVar9._0_4_;
  auVar239._4_4_ = auVar96._4_4_ * auVar9._4_4_;
  auVar239._8_4_ = auVar96._8_4_ * auVar9._8_4_;
  auVar239._12_4_ = auVar96._12_4_ * auVar9._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar194);
  auVar96 = vsubps_avx(auVar96,auVar88);
  auVar116._0_4_ = auVar9._0_4_ * auVar96._0_4_;
  auVar116._4_4_ = auVar9._4_4_ * auVar96._4_4_;
  auVar116._8_4_ = auVar9._8_4_ * auVar96._8_4_;
  auVar116._12_4_ = auVar9._12_4_ * auVar96._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar82 + uVar79 + 6);
  auVar96 = vpmovsxwd_avx(auVar9);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar155);
  auVar167._0_4_ = auVar89._0_4_ * auVar96._0_4_;
  auVar167._4_4_ = auVar89._4_4_ * auVar96._4_4_;
  auVar167._8_4_ = auVar89._8_4_ * auVar96._8_4_;
  auVar167._12_4_ = auVar89._12_4_ * auVar96._12_4_;
  local_790 = prim;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = *(ulong *)(prim + uVar79 * 0x17 + 6);
  auVar96 = vpmovsxwd_avx(auVar272);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar155);
  auVar88._0_4_ = auVar89._0_4_ * auVar96._0_4_;
  auVar88._4_4_ = auVar89._4_4_ * auVar96._4_4_;
  auVar88._8_4_ = auVar89._8_4_ * auVar96._8_4_;
  auVar88._12_4_ = auVar89._12_4_ * auVar96._12_4_;
  auVar96 = vpminsd_avx(auVar192,auVar212);
  auVar194 = vpminsd_avx(auVar239,auVar116);
  auVar96 = vmaxps_avx(auVar96,auVar194);
  auVar194 = vpminsd_avx(auVar167,auVar88);
  uVar81 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar250._4_4_ = uVar81;
  auVar250._0_4_ = uVar81;
  auVar250._8_4_ = uVar81;
  auVar250._12_4_ = uVar81;
  auVar194 = vmaxps_avx(auVar194,auVar250);
  auVar96 = vmaxps_avx(auVar96,auVar194);
  local_4f0._0_4_ = auVar96._0_4_ * 0.99999964;
  local_4f0._4_4_ = auVar96._4_4_ * 0.99999964;
  local_4f0._8_4_ = auVar96._8_4_ * 0.99999964;
  local_4f0._12_4_ = auVar96._12_4_ * 0.99999964;
  auVar96 = vpmaxsd_avx(auVar192,auVar212);
  auVar194 = vpmaxsd_avx(auVar239,auVar116);
  auVar96 = vminps_avx(auVar96,auVar194);
  auVar194 = vpmaxsd_avx(auVar167,auVar88);
  fVar114 = (ray->super_RayK<1>).tfar;
  auVar155._4_4_ = fVar114;
  auVar155._0_4_ = fVar114;
  auVar155._8_4_ = fVar114;
  auVar155._12_4_ = fVar114;
  auVar194 = vminps_avx(auVar194,auVar155);
  auVar96 = vminps_avx(auVar96,auVar194);
  auVar89._0_4_ = auVar96._0_4_ * 1.0000004;
  auVar89._4_4_ = auVar96._4_4_ * 1.0000004;
  auVar89._8_4_ = auVar96._8_4_ * 1.0000004;
  auVar89._12_4_ = auVar96._12_4_ * 1.0000004;
  auVar117[4] = PVar4;
  auVar117._5_3_ = 0;
  auVar117[8] = PVar4;
  auVar117._9_3_ = 0;
  auVar117[0xc] = PVar4;
  auVar117._13_3_ = 0;
  auVar194 = vpcmpgtd_avx(auVar117,_DAT_01ff0cf0);
  auVar96 = vcmpps_avx(local_4f0,auVar89,2);
  auVar96 = vandps_avx(auVar96,auVar194);
  uVar78 = vmovmskps_avx(auVar96);
  if (uVar78 == 0) {
    return;
  }
  uVar78 = uVar78 & 0xff;
  auVar108._16_16_ = mm_lookupmask_ps._240_16_;
  auVar108._0_16_ = mm_lookupmask_ps._240_16_;
  local_380 = vblendps_avx(auVar108,ZEXT832(0) << 0x20,0x80);
  local_780 = 0x7fffffff;
  uStack_77c = 0x7fffffff;
  uStack_778 = 0x7fffffff;
  uStack_774 = 0x7fffffff;
  uStack_770 = 0x7fffffff;
  uStack_76c = 0x7fffffff;
  uStack_768 = 0x7fffffff;
  uStack_764 = 0x7fffffff;
LAB_01687f9f:
  uVar82 = (ulong)uVar78;
  local_788 = uVar82;
  lVar83 = 0;
  for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
    lVar83 = lVar83 + 1;
  }
  local_ae8 = (ulong)*(uint *)(local_790 + 2);
  pGVar5 = (context->scene->geometries).items[*(uint *)(local_790 + 2)].ptr;
  local_a78 = (ulong)*(uint *)(local_790 + lVar83 * 4 + 6);
  lVar6 = *(long *)&pGVar5[1].time_range.upper;
  uVar82 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)*(uint *)(local_790 + lVar83 * 4 + 6) *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar96 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * uVar82);
  auVar194 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * (uVar82 + 1));
  auVar90._8_4_ = 0xbeaaaaab;
  auVar90._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar90._12_4_ = 0xbeaaaaab;
  auVar89 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar5[2].intersectionFilterN +
                              uVar82 * (long)pGVar5[2].pointQueryFunc),auVar96,auVar90);
  auVar272 = vfmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar5[2].intersectionFilterN +
                              (long)pGVar5[2].pointQueryFunc * (uVar82 + 1)),auVar194,auVar90);
  auVar213._0_4_ = (auVar194._0_4_ + auVar96._0_4_ + auVar89._0_4_ + auVar272._0_4_) * 0.25;
  auVar213._4_4_ = (auVar194._4_4_ + auVar96._4_4_ + auVar89._4_4_ + auVar272._4_4_) * 0.25;
  auVar213._8_4_ = (auVar194._8_4_ + auVar96._8_4_ + auVar89._8_4_ + auVar272._8_4_) * 0.25;
  auVar213._12_4_ = (auVar194._12_4_ + auVar96._12_4_ + auVar89._12_4_ + auVar272._12_4_) * 0.25;
  aVar2 = (ray->super_RayK<1>).org.field_0;
  aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar218 = vsubps_avx(auVar213,(undefined1  [16])aVar2);
  auVar218 = vdpps_avx(auVar218,(undefined1  [16])aVar3,0x7f);
  auVar124 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar9 = vrcpss_avx(auVar124,auVar124);
  auVar246 = ZEXT1664(auVar9);
  auVar124 = vfnmadd213ss_fma(auVar9,auVar124,ZEXT416(0x40000000));
  auVar253 = ZEXT1664(auVar124);
  fVar114 = auVar218._0_4_ * auVar9._0_4_ * auVar124._0_4_;
  local_7a0 = ZEXT416((uint)fVar114);
  auVar214._4_4_ = fVar114;
  auVar214._0_4_ = fVar114;
  auVar214._8_4_ = fVar114;
  auVar214._12_4_ = fVar114;
  fStack_730 = fVar114;
  _local_740 = auVar214;
  fStack_72c = fVar114;
  fStack_728 = fVar114;
  fStack_724 = fVar114;
  auVar218 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar214);
  auVar218 = vblendps_avx(auVar218,_DAT_01feba10,8);
  local_a10 = vsubps_avx(auVar96,auVar218);
  local_a20 = vsubps_avx(auVar272,auVar218);
  auVar203 = ZEXT1664(local_a20);
  local_a30 = vsubps_avx(auVar89,auVar218);
  _local_a40 = vsubps_avx(auVar194,auVar218);
  auVar225 = ZEXT1664(_local_a40);
  auVar96 = vmovshdup_avx(local_a10);
  local_1a0 = auVar96._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar96 = vshufps_avx(local_a10,local_a10,0xaa);
  local_1c0 = auVar96._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar96 = vshufps_avx(local_a10,local_a10,0xff);
  local_1e0 = auVar96._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar96 = vmovshdup_avx(local_a30);
  local_200 = auVar96._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar96 = vshufps_avx(local_a30,local_a30,0xaa);
  local_220 = auVar96._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar96 = vshufps_avx(local_a30,local_a30,0xff);
  local_240 = auVar96._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar96 = vmovshdup_avx(local_a20);
  local_400 = auVar96._0_4_;
  fStack_3fc = auVar96._4_4_;
  auVar96 = vshufps_avx(local_a20,local_a20,0xaa);
  local_420 = auVar96._0_4_;
  fStack_41c = auVar96._4_4_;
  auVar96 = vshufps_avx(local_a20,local_a20,0xff);
  local_260 = auVar96._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar96 = vmovshdup_avx(_local_a40);
  local_280 = auVar96._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar96 = vshufps_avx(_local_a40,_local_a40,0xaa);
  local_2a0 = auVar96._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar96 = vshufps_avx(_local_a40,_local_a40,0xff);
  local_2c0 = auVar96._0_8_;
  uStack_2b8 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2a8 = local_2c0;
  auVar91._0_4_ = aVar3.x * aVar3.x;
  auVar91._4_4_ = aVar3.y * aVar3.y;
  auVar91._8_4_ = aVar3.z * aVar3.z;
  auVar91._12_4_ = aVar3.field_3.w * aVar3.field_3.w;
  auVar96 = vshufps_avx(auVar91,auVar91,0xaa);
  auVar100._0_8_ = auVar96._0_8_;
  auVar100._8_8_ = auVar100._0_8_;
  auVar100._16_8_ = auVar100._0_8_;
  auVar100._24_8_ = auVar100._0_8_;
  uVar81 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_620._4_4_ = uVar81;
  local_620._0_4_ = uVar81;
  fStack_618 = (float)uVar81;
  fStack_614 = (float)uVar81;
  fStack_610 = (float)uVar81;
  fStack_60c = (float)uVar81;
  fStack_608 = (float)uVar81;
  register0x0000125c = uVar81;
  uVar81 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_640._4_4_ = uVar81;
  local_640._0_4_ = uVar81;
  fStack_638 = (float)uVar81;
  fStack_634 = (float)uVar81;
  fStack_630 = (float)uVar81;
  fStack_62c = (float)uVar81;
  fStack_628 = (float)uVar81;
  register0x000013dc = uVar81;
  auVar237 = ZEXT3264(_local_640);
  auVar96 = vfmadd231ps_fma(auVar100,_local_640,_local_640);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),_local_620,_local_620);
  uVar82 = 1;
  uVar79 = 0;
  local_660 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  local_300 = local_a10._0_4_;
  uStack_2fc = local_300;
  uStack_2f8 = local_300;
  uStack_2f4 = local_300;
  uStack_2f0 = local_300;
  uStack_2ec = local_300;
  uStack_2e8 = local_300;
  uStack_2e4 = local_300;
  local_320 = local_a30._0_4_;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_340 = local_a20._0_4_;
  fStack_33c = local_340;
  fStack_338 = local_340;
  fStack_334 = local_340;
  fStack_330 = local_340;
  fStack_32c = local_340;
  fStack_328 = local_340;
  fStack_324 = local_340;
  local_360 = local_a40._0_4_;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  local_2e0 = ZEXT1632(auVar96);
  auVar144._4_4_ = uStack_77c;
  auVar144._0_4_ = local_780;
  auVar144._8_4_ = uStack_778;
  auVar144._12_4_ = uStack_774;
  auVar144._16_4_ = uStack_770;
  auVar144._20_4_ = uStack_76c;
  auVar144._24_4_ = uStack_768;
  auVar144._28_4_ = uStack_764;
  local_440 = vandps_avx(ZEXT1632(auVar96),auVar144);
  local_7b0 = 0x3f80000000000000;
  uStack_7a8 = 0;
  fStack_418 = local_420;
  fStack_414 = fStack_41c;
  fStack_410 = local_420;
  fStack_40c = fStack_41c;
  fStack_408 = local_420;
  fStack_404 = fStack_41c;
  fStack_3f8 = local_400;
  fStack_3f4 = fStack_3fc;
  fStack_3f0 = local_400;
  fStack_3ec = fStack_3fc;
  fStack_3e8 = local_400;
  fStack_3e4 = fStack_3fc;
  do {
    auVar181._8_4_ = 0x3f800000;
    auVar181._0_8_ = &DAT_3f8000003f800000;
    auVar181._12_4_ = 0x3f800000;
    auVar181._16_4_ = 0x3f800000;
    auVar181._20_4_ = 0x3f800000;
    auVar181._24_4_ = 0x3f800000;
    auVar181._28_4_ = 0x3f800000;
    auVar58._8_8_ = uStack_7a8;
    auVar58._0_8_ = local_7b0;
    auVar96 = vmovshdup_avx(auVar58);
    local_800._0_4_ = (undefined4)local_7b0;
    fVar114 = auVar96._0_4_ - (float)local_800._0_4_;
    fVar151 = fVar114 * 0.04761905;
    local_800._4_4_ = local_800._0_4_;
    local_800._8_4_ = local_800._0_4_;
    local_800._12_4_ = local_800._0_4_;
    local_800._16_4_ = local_800._0_4_;
    local_800._20_4_ = local_800._0_4_;
    local_800._24_4_ = local_800._0_4_;
    local_800._28_4_ = local_800._0_4_;
    local_860._4_4_ = fVar114;
    local_860._0_4_ = fVar114;
    local_860._8_4_ = fVar114;
    local_860._12_4_ = fVar114;
    local_860._16_4_ = fVar114;
    local_860._20_4_ = fVar114;
    local_860._24_4_ = fVar114;
    local_860._28_4_ = fVar114;
    auVar96 = vfmadd231ps_fma(local_800,local_860,_DAT_02020f20);
    auVar108 = vsubps_avx(auVar181,ZEXT1632(auVar96));
    auVar69._4_4_ = fStack_31c;
    auVar69._0_4_ = local_320;
    auVar69._8_4_ = fStack_318;
    auVar69._12_4_ = fStack_314;
    auVar69._16_4_ = fStack_310;
    auVar69._20_4_ = fStack_30c;
    auVar69._24_4_ = fStack_308;
    auVar69._28_4_ = fStack_304;
    fVar114 = auVar96._0_4_;
    auVar267._0_4_ = local_320 * fVar114;
    fVar85 = auVar96._4_4_;
    auVar267._4_4_ = fStack_31c * fVar85;
    fVar146 = auVar96._8_4_;
    auVar267._8_4_ = fStack_318 * fVar146;
    fVar247 = auVar96._12_4_;
    auVar267._12_4_ = fStack_314 * fVar247;
    auVar267._16_4_ = fStack_310 * 0.0;
    auVar267._20_4_ = fStack_30c * 0.0;
    auVar267._28_36_ = auVar266._28_36_;
    auVar267._24_4_ = fStack_308 * 0.0;
    auVar74._8_8_ = uStack_1f8;
    auVar74._0_8_ = local_200;
    auVar74._16_8_ = uStack_1f0;
    auVar74._24_8_ = uStack_1e8;
    auVar258._0_4_ = (float)local_200 * fVar114;
    auVar258._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar85;
    auVar258._8_4_ = (float)uStack_1f8 * fVar146;
    auVar258._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar247;
    auVar258._16_4_ = (float)uStack_1f0 * 0.0;
    auVar258._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar258._28_36_ = auVar257._28_36_;
    auVar258._24_4_ = (float)uStack_1e8 * 0.0;
    auVar73._8_8_ = uStack_218;
    auVar73._0_8_ = local_220;
    auVar73._16_8_ = uStack_210;
    auVar73._24_8_ = uStack_208;
    auVar254._0_4_ = (float)local_220 * fVar114;
    auVar254._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar85;
    auVar254._8_4_ = (float)uStack_218 * fVar146;
    auVar254._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar247;
    auVar254._16_4_ = (float)uStack_210 * 0.0;
    auVar254._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar254._28_36_ = auVar253._28_36_;
    auVar254._24_4_ = (float)uStack_208 * 0.0;
    auVar72._8_8_ = uStack_238;
    auVar72._0_8_ = local_240;
    auVar72._16_8_ = uStack_230;
    auVar72._24_8_ = uStack_228;
    auVar253._0_4_ = (float)local_240 * fVar114;
    auVar253._4_4_ = (float)((ulong)local_240 >> 0x20) * fVar85;
    auVar253._8_4_ = (float)uStack_238 * fVar146;
    auVar253._12_4_ = (float)((ulong)uStack_238 >> 0x20) * fVar247;
    auVar253._16_4_ = (float)uStack_230 * 0.0;
    auVar253._20_4_ = (float)((ulong)uStack_230 >> 0x20) * 0.0;
    auVar253._28_36_ = auVar237._28_36_;
    auVar253._24_4_ = (float)uStack_228 * 0.0;
    auVar70._4_4_ = uStack_2fc;
    auVar70._0_4_ = local_300;
    auVar70._8_4_ = uStack_2f8;
    auVar70._12_4_ = uStack_2f4;
    auVar70._16_4_ = uStack_2f0;
    auVar70._20_4_ = uStack_2ec;
    auVar70._24_4_ = uStack_2e8;
    auVar70._28_4_ = uStack_2e4;
    auVar96 = vfmadd231ps_fma(auVar267._0_32_,auVar108,auVar70);
    auVar77._8_8_ = uStack_198;
    auVar77._0_8_ = local_1a0;
    auVar77._16_8_ = uStack_190;
    auVar77._24_8_ = uStack_188;
    auVar194 = vfmadd231ps_fma(auVar258._0_32_,auVar108,auVar77);
    auVar76._8_8_ = uStack_1b8;
    auVar76._0_8_ = local_1c0;
    auVar76._16_8_ = uStack_1b0;
    auVar76._24_8_ = uStack_1a8;
    auVar218 = vfmadd231ps_fma(auVar254._0_32_,auVar108,auVar76);
    auVar75._8_8_ = uStack_1d8;
    auVar75._0_8_ = local_1e0;
    auVar75._16_8_ = uStack_1d0;
    auVar75._24_8_ = uStack_1c8;
    auVar124 = vfmadd231ps_fma(auVar253._0_32_,auVar108,auVar75);
    auVar68._4_4_ = fStack_33c;
    auVar68._0_4_ = local_340;
    auVar68._8_4_ = fStack_338;
    auVar68._12_4_ = fStack_334;
    auVar68._16_4_ = fStack_330;
    auVar68._20_4_ = fStack_32c;
    auVar68._24_4_ = fStack_328;
    auVar68._28_4_ = fStack_324;
    auVar237._0_4_ = local_340 * fVar114;
    auVar237._4_4_ = fStack_33c * fVar85;
    auVar237._8_4_ = fStack_338 * fVar146;
    auVar237._12_4_ = fStack_334 * fVar247;
    auVar237._16_4_ = fStack_330 * 0.0;
    auVar237._20_4_ = fStack_32c * 0.0;
    auVar237._28_36_ = auVar246._28_36_;
    auVar237._24_4_ = fStack_328 * 0.0;
    auVar266._0_4_ = fVar114 * local_400;
    auVar266._4_4_ = fVar85 * fStack_3fc;
    auVar266._8_4_ = fVar146 * fStack_3f8;
    auVar266._12_4_ = fVar247 * fStack_3f4;
    auVar266._16_4_ = fStack_3f0 * 0.0;
    auVar266._20_4_ = fStack_3ec * 0.0;
    auVar266._28_36_ = auVar225._28_36_;
    auVar266._24_4_ = fStack_3e8 * 0.0;
    auVar257._0_4_ = fVar114 * local_420;
    auVar257._4_4_ = fVar85 * fStack_41c;
    auVar257._8_4_ = fVar146 * fStack_418;
    auVar257._12_4_ = fVar247 * fStack_414;
    auVar257._16_4_ = fStack_410 * 0.0;
    auVar257._20_4_ = fStack_40c * 0.0;
    auVar257._28_36_ = auVar203._28_36_;
    auVar257._24_4_ = fStack_408 * 0.0;
    auVar71._8_8_ = uStack_258;
    auVar71._0_8_ = local_260;
    auVar71._16_8_ = uStack_250;
    auVar71._24_8_ = uStack_248;
    auVar50._4_4_ = (float)((ulong)local_260 >> 0x20) * fVar85;
    auVar50._0_4_ = (float)local_260 * fVar114;
    auVar50._8_4_ = (float)uStack_258 * fVar146;
    auVar50._12_4_ = (float)((ulong)uStack_258 >> 0x20) * fVar247;
    auVar50._16_4_ = (float)uStack_250 * 0.0;
    auVar50._20_4_ = (float)((ulong)uStack_250 >> 0x20) * 0.0;
    auVar50._24_4_ = (float)uStack_248 * 0.0;
    auVar50._28_4_ = 0x3f800000;
    auVar9 = vfmadd231ps_fma(auVar237._0_32_,auVar108,auVar69);
    auVar272 = vfmadd231ps_fma(auVar266._0_32_,auVar108,auVar74);
    auVar89 = vfmadd231ps_fma(auVar257._0_32_,auVar108,auVar73);
    auVar88 = vfmadd231ps_fma(auVar50,auVar108,auVar72);
    auVar12._4_4_ = fVar85 * fStack_35c;
    auVar12._0_4_ = fVar114 * local_360;
    auVar12._8_4_ = fVar146 * fStack_358;
    auVar12._12_4_ = fVar247 * fStack_354;
    auVar12._16_4_ = fStack_350 * 0.0;
    auVar12._20_4_ = fStack_34c * 0.0;
    auVar12._24_4_ = fStack_348 * 0.0;
    auVar12._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    auVar157._4_4_ = fVar85 * local_280._4_4_;
    auVar157._0_4_ = fVar114 * (float)local_280;
    auVar157._8_4_ = fVar146 * (float)uStack_278;
    auVar157._12_4_ = fVar247 * uStack_278._4_4_;
    auVar157._16_4_ = (float)uStack_270 * 0.0;
    auVar157._20_4_ = uStack_270._4_4_ * 0.0;
    auVar157._24_4_ = (float)uStack_268 * 0.0;
    auVar157._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar229._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar229._0_28_ =
         ZEXT1628(CONCAT412(auVar9._12_4_ * fVar247,
                            CONCAT48(auVar9._8_4_ * fVar146,
                                     CONCAT44(auVar9._4_4_ * fVar85,auVar9._0_4_ * fVar114))));
    auVar96 = vfmadd231ps_fma(auVar229,auVar108,ZEXT1632(auVar96));
    auVar194 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar247 * auVar272._12_4_,
                                                  CONCAT48(fVar146 * auVar272._8_4_,
                                                           CONCAT44(fVar85 * auVar272._4_4_,
                                                                    fVar114 * auVar272._0_4_)))),
                               auVar108,ZEXT1632(auVar194));
    auVar218 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar247 * auVar89._12_4_,
                                                  CONCAT48(fVar146 * auVar89._8_4_,
                                                           CONCAT44(fVar85 * auVar89._4_4_,
                                                                    fVar114 * auVar89._0_4_)))),
                               auVar108,ZEXT1632(auVar218));
    auVar124 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar247 * auVar88._12_4_,
                                                  CONCAT48(fVar146 * auVar88._8_4_,
                                                           CONCAT44(fVar85 * auVar88._4_4_,
                                                                    fVar114 * auVar88._0_4_)))),
                               auVar108,ZEXT1632(auVar124));
    auVar235._0_4_ = fVar114 * (float)local_2a0;
    auVar235._4_4_ = fVar85 * local_2a0._4_4_;
    auVar235._8_4_ = fVar146 * (float)uStack_298;
    auVar235._12_4_ = fVar247 * uStack_298._4_4_;
    auVar235._16_4_ = (float)uStack_290 * 0.0;
    auVar235._20_4_ = uStack_290._4_4_ * 0.0;
    auVar235._24_4_ = (float)uStack_288 * 0.0;
    auVar235._28_4_ = 0;
    auVar155 = vfmadd231ps_fma(auVar12,auVar108,auVar68);
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar155._12_4_ * fVar247,
                                                CONCAT48(auVar155._8_4_ * fVar146,
                                                         CONCAT44(auVar155._4_4_ * fVar85,
                                                                  auVar155._0_4_ * fVar114)))),
                             auVar108,ZEXT1632(auVar9));
    auVar241._0_4_ = fVar114 * (float)local_2c0;
    auVar241._4_4_ = fVar85 * local_2c0._4_4_;
    auVar241._8_4_ = fVar146 * (float)uStack_2b8;
    auVar241._12_4_ = fVar247 * uStack_2b8._4_4_;
    auVar241._16_4_ = (float)uStack_2b0 * 0.0;
    auVar241._20_4_ = uStack_2b0._4_4_ * 0.0;
    auVar241._24_4_ = (float)uStack_2a8 * 0.0;
    auVar241._28_4_ = 0;
    auVar67._4_4_ = fStack_3fc;
    auVar67._0_4_ = local_400;
    auVar67._8_4_ = fStack_3f8;
    auVar67._12_4_ = fStack_3f4;
    auVar67._16_4_ = fStack_3f0;
    auVar67._20_4_ = fStack_3ec;
    auVar67._24_4_ = fStack_3e8;
    auVar67._28_4_ = fStack_3e4;
    auVar155 = vfmadd231ps_fma(auVar157,auVar108,auVar67);
    auVar66._4_4_ = fStack_41c;
    auVar66._0_4_ = local_420;
    auVar66._8_4_ = fStack_418;
    auVar66._12_4_ = fStack_414;
    auVar66._16_4_ = fStack_410;
    auVar66._20_4_ = fStack_40c;
    auVar66._24_4_ = fStack_408;
    auVar66._28_4_ = fStack_404;
    auVar116 = vfmadd231ps_fma(auVar235,auVar108,auVar66);
    auVar87 = vfmadd231ps_fma(auVar241,auVar108,auVar71);
    auVar186._28_4_ = fStack_324;
    auVar186._0_28_ =
         ZEXT1628(CONCAT412(auVar87._12_4_ * fVar247,
                            CONCAT48(auVar87._8_4_ * fVar146,
                                     CONCAT44(auVar87._4_4_ * fVar85,auVar87._0_4_ * fVar114))));
    auVar272 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar155._12_4_ * fVar247,
                                                  CONCAT48(auVar155._8_4_ * fVar146,
                                                           CONCAT44(auVar155._4_4_ * fVar85,
                                                                    auVar155._0_4_ * fVar114)))),
                               auVar108,ZEXT1632(auVar272));
    auVar89 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar247 * auVar116._12_4_,
                                                 CONCAT48(fVar146 * auVar116._8_4_,
                                                          CONCAT44(fVar85 * auVar116._4_4_,
                                                                   fVar114 * auVar116._0_4_)))),
                              auVar108,ZEXT1632(auVar89));
    auVar88 = vfmadd231ps_fma(auVar186,auVar108,ZEXT1632(auVar88));
    auVar256._28_4_ = fStack_304;
    auVar256._0_28_ =
         ZEXT1628(CONCAT412(auVar272._12_4_ * fVar247,
                            CONCAT48(auVar272._8_4_ * fVar146,
                                     CONCAT44(auVar272._4_4_ * fVar85,auVar272._0_4_ * fVar114))));
    auVar274._28_4_ = (int)((ulong)uStack_248 >> 0x20);
    auVar274._0_28_ =
         ZEXT1628(CONCAT412(fVar247 * auVar89._12_4_,
                            CONCAT48(fVar146 * auVar89._8_4_,
                                     CONCAT44(fVar85 * auVar89._4_4_,fVar114 * auVar89._0_4_))));
    auVar155 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar9._12_4_ * fVar247,
                                                  CONCAT48(auVar9._8_4_ * fVar146,
                                                           CONCAT44(auVar9._4_4_ * fVar85,
                                                                    auVar9._0_4_ * fVar114)))),
                               auVar108,ZEXT1632(auVar96));
    auVar116 = vfmadd231ps_fma(auVar256,auVar108,ZEXT1632(auVar194));
    local_ae0 = ZEXT1632(auVar116);
    auVar116 = vfmadd231ps_fma(auVar274,auVar108,ZEXT1632(auVar218));
    auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar88._12_4_ * fVar247,
                                                 CONCAT48(auVar88._8_4_ * fVar146,
                                                          CONCAT44(auVar88._4_4_ * fVar85,
                                                                   auVar88._0_4_ * fVar114)))),
                              ZEXT1632(auVar124),auVar108);
    auVar144 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar96));
    auVar108 = vsubps_avx(ZEXT1632(auVar272),ZEXT1632(auVar194));
    auVar100 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar218));
    auVar12 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar124));
    auVar227._0_4_ = fVar151 * auVar144._0_4_ * 3.0;
    auVar227._4_4_ = fVar151 * auVar144._4_4_ * 3.0;
    auVar227._8_4_ = fVar151 * auVar144._8_4_ * 3.0;
    auVar227._12_4_ = fVar151 * auVar144._12_4_ * 3.0;
    auVar227._16_4_ = fVar151 * auVar144._16_4_ * 3.0;
    auVar227._20_4_ = fVar151 * auVar144._20_4_ * 3.0;
    auVar227._24_4_ = fVar151 * auVar144._24_4_ * 3.0;
    local_900._28_4_ = 0;
    local_900._0_28_ = auVar227;
    local_820._0_4_ = fVar151 * auVar108._0_4_ * 3.0;
    local_820._4_4_ = fVar151 * auVar108._4_4_ * 3.0;
    local_820._8_4_ = fVar151 * auVar108._8_4_ * 3.0;
    local_820._12_4_ = fVar151 * auVar108._12_4_ * 3.0;
    local_820._16_4_ = fVar151 * auVar108._16_4_ * 3.0;
    local_820._20_4_ = fVar151 * auVar108._20_4_ * 3.0;
    local_820._24_4_ = fVar151 * auVar108._24_4_ * 3.0;
    local_820._28_4_ = 0;
    local_840._0_4_ = fVar151 * auVar100._0_4_ * 3.0;
    local_840._4_4_ = fVar151 * auVar100._4_4_ * 3.0;
    local_840._8_4_ = fVar151 * auVar100._8_4_ * 3.0;
    local_840._12_4_ = fVar151 * auVar100._12_4_ * 3.0;
    local_840._16_4_ = fVar151 * auVar100._16_4_ * 3.0;
    local_840._20_4_ = fVar151 * auVar100._20_4_ * 3.0;
    local_840._24_4_ = fVar151 * auVar100._24_4_ * 3.0;
    local_840._28_4_ = 0;
    fVar114 = fVar151 * auVar12._0_4_ * 3.0;
    fVar146 = fVar151 * auVar12._4_4_ * 3.0;
    auVar10._4_4_ = fVar146;
    auVar10._0_4_ = fVar114;
    fVar147 = fVar151 * auVar12._8_4_ * 3.0;
    auVar10._8_4_ = fVar147;
    fVar148 = fVar151 * auVar12._12_4_ * 3.0;
    auVar10._12_4_ = fVar148;
    fVar149 = fVar151 * auVar12._16_4_ * 3.0;
    auVar10._16_4_ = fVar149;
    fVar150 = fVar151 * auVar12._20_4_ * 3.0;
    auVar10._20_4_ = fVar150;
    fVar151 = fVar151 * auVar12._24_4_ * 3.0;
    auVar10._24_4_ = fVar151;
    auVar10._28_4_ = auVar144._28_4_;
    local_ac0 = ZEXT1632(auVar155);
    _local_9c0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar155));
    _local_8e0 = vpermps_avx2(_DAT_0205d4a0,local_ae0);
    local_7e0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar116));
    local_580 = vsubps_avx(_local_9c0,local_ac0);
    _local_6c0 = vsubps_avx(local_7e0,ZEXT1632(auVar116));
    fVar163 = local_6c0._0_4_;
    fVar164 = local_6c0._4_4_;
    auVar11._4_4_ = fVar164 * auVar227._4_4_;
    auVar11._0_4_ = fVar163 * auVar227._0_4_;
    fVar165 = local_6c0._8_4_;
    auVar11._8_4_ = fVar165 * auVar227._8_4_;
    fVar166 = local_6c0._12_4_;
    auVar11._12_4_ = fVar166 * auVar227._12_4_;
    fVar208 = local_6c0._16_4_;
    auVar11._16_4_ = fVar208 * auVar227._16_4_;
    fVar209 = local_6c0._20_4_;
    auVar11._20_4_ = fVar209 * auVar227._20_4_;
    fVar232 = local_6c0._24_4_;
    auVar11._24_4_ = fVar232 * auVar227._24_4_;
    auVar11._28_4_ = local_7e0._28_4_;
    auVar96 = vfmsub231ps_fma(auVar11,local_840,local_580);
    local_5a0 = vsubps_avx(_local_8e0,local_ae0);
    fVar261 = local_580._0_4_;
    fVar281 = local_580._4_4_;
    auVar14._4_4_ = fVar281 * local_820._4_4_;
    auVar14._0_4_ = fVar261 * local_820._0_4_;
    fVar282 = local_580._8_4_;
    auVar14._8_4_ = fVar282 * local_820._8_4_;
    fVar283 = local_580._12_4_;
    auVar14._12_4_ = fVar283 * local_820._12_4_;
    fVar284 = local_580._16_4_;
    auVar14._16_4_ = fVar284 * local_820._16_4_;
    fVar285 = local_580._20_4_;
    auVar14._20_4_ = fVar285 * local_820._20_4_;
    fVar286 = local_580._24_4_;
    auVar14._24_4_ = fVar286 * local_820._24_4_;
    auVar14._28_4_ = local_9c0._28_4_;
    auVar194 = vfmsub231ps_fma(auVar14,local_900,local_5a0);
    auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar194._12_4_ * auVar194._12_4_,
                                                 CONCAT48(auVar194._8_4_ * auVar194._8_4_,
                                                          CONCAT44(auVar194._4_4_ * auVar194._4_4_,
                                                                   auVar194._0_4_ * auVar194._0_4_))
                                                )),ZEXT1632(auVar96),ZEXT1632(auVar96));
    fVar190 = local_5a0._0_4_;
    fVar204 = local_5a0._4_4_;
    auVar15._4_4_ = fVar204 * local_840._4_4_;
    auVar15._0_4_ = fVar190 * (float)local_840._0_4_;
    fVar205 = local_5a0._8_4_;
    auVar15._8_4_ = fVar205 * local_840._8_4_;
    fVar206 = local_5a0._12_4_;
    auVar15._12_4_ = fVar206 * local_840._12_4_;
    fVar207 = local_5a0._16_4_;
    auVar15._16_4_ = fVar207 * local_840._16_4_;
    fVar259 = local_5a0._20_4_;
    auVar15._20_4_ = fVar259 * local_840._20_4_;
    fVar260 = local_5a0._24_4_;
    auVar15._24_4_ = fVar260 * local_840._24_4_;
    auVar15._28_4_ = local_8e0._28_4_;
    auVar218 = vfmsub231ps_fma(auVar15,local_820,_local_6c0);
    auVar182._0_4_ = fVar163 * fVar163;
    auVar182._4_4_ = fVar164 * fVar164;
    auVar182._8_4_ = fVar165 * fVar165;
    auVar182._12_4_ = fVar166 * fVar166;
    auVar182._16_4_ = fVar208 * fVar208;
    auVar182._20_4_ = fVar209 * fVar209;
    auVar182._24_4_ = fVar232 * fVar232;
    auVar182._28_4_ = 0;
    auVar194 = vfmadd231ps_fma(auVar182,local_5a0,local_5a0);
    auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),local_580,local_580);
    auVar108 = vrcpps_avx(ZEXT1632(auVar194));
    auVar218 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar218),ZEXT1632(auVar218));
    auVar268._8_4_ = 0x3f800000;
    auVar268._0_8_ = &DAT_3f8000003f800000;
    auVar268._12_4_ = 0x3f800000;
    auVar268._16_4_ = 0x3f800000;
    auVar268._20_4_ = 0x3f800000;
    auVar268._24_4_ = 0x3f800000;
    auVar268._28_4_ = 0x3f800000;
    auVar96 = vfnmadd213ps_fma(auVar108,ZEXT1632(auVar194),auVar268);
    auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar108,auVar108);
    local_920 = vpermps_avx2(_DAT_0205d4a0,local_900);
    local_9e0 = vpermps_avx2(_DAT_0205d4a0,local_840);
    auVar16._4_4_ = local_920._4_4_ * fVar164;
    auVar16._0_4_ = local_920._0_4_ * fVar163;
    auVar16._8_4_ = local_920._8_4_ * fVar165;
    auVar16._12_4_ = local_920._12_4_ * fVar166;
    auVar16._16_4_ = local_920._16_4_ * fVar208;
    auVar16._20_4_ = local_920._20_4_ * fVar209;
    auVar16._24_4_ = local_920._24_4_ * fVar232;
    auVar16._28_4_ = auVar108._28_4_;
    auVar124 = vfmsub231ps_fma(auVar16,local_9e0,local_580);
    local_940 = vpermps_avx2(_DAT_0205d4a0,local_820);
    auVar17._4_4_ = fVar281 * local_940._4_4_;
    auVar17._0_4_ = fVar261 * local_940._0_4_;
    auVar17._8_4_ = fVar282 * local_940._8_4_;
    auVar17._12_4_ = fVar283 * local_940._12_4_;
    auVar17._16_4_ = fVar284 * local_940._16_4_;
    auVar17._20_4_ = fVar285 * local_940._20_4_;
    auVar17._24_4_ = fVar286 * local_940._24_4_;
    auVar17._28_4_ = 0;
    auVar9 = vfmsub231ps_fma(auVar17,local_920,local_5a0);
    auVar124 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar9._12_4_ * auVar9._12_4_,
                                                  CONCAT48(auVar9._8_4_ * auVar9._8_4_,
                                                           CONCAT44(auVar9._4_4_ * auVar9._4_4_,
                                                                    auVar9._0_4_ * auVar9._0_4_)))),
                               ZEXT1632(auVar124),ZEXT1632(auVar124));
    fVar85 = local_9e0._0_4_;
    auVar220._0_4_ = fVar190 * fVar85;
    fVar247 = local_9e0._4_4_;
    auVar220._4_4_ = fVar204 * fVar247;
    fVar248 = local_9e0._8_4_;
    auVar220._8_4_ = fVar205 * fVar248;
    fVar249 = local_9e0._12_4_;
    auVar220._12_4_ = fVar206 * fVar249;
    fVar288 = local_9e0._16_4_;
    auVar220._16_4_ = fVar207 * fVar288;
    fVar289 = local_9e0._20_4_;
    auVar220._20_4_ = fVar259 * fVar289;
    fVar290 = local_9e0._24_4_;
    auVar220._24_4_ = fVar260 * fVar290;
    auVar220._28_4_ = 0;
    auVar9 = vfmsub231ps_fma(auVar220,local_940,_local_6c0);
    auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),ZEXT1632(auVar9),ZEXT1632(auVar9));
    auVar108 = vmaxps_avx(ZEXT1632(CONCAT412(auVar218._12_4_ * auVar96._12_4_,
                                             CONCAT48(auVar218._8_4_ * auVar96._8_4_,
                                                      CONCAT44(auVar218._4_4_ * auVar96._4_4_,
                                                               auVar218._0_4_ * auVar96._0_4_)))),
                          ZEXT1632(CONCAT412(auVar124._12_4_ * auVar96._12_4_,
                                             CONCAT48(auVar124._8_4_ * auVar96._8_4_,
                                                      CONCAT44(auVar124._4_4_ * auVar96._4_4_,
                                                               auVar124._0_4_ * auVar96._0_4_)))));
    local_8a0._0_4_ = auVar87._0_4_ + fVar114;
    local_8a0._4_4_ = auVar87._4_4_ + fVar146;
    local_8a0._8_4_ = auVar87._8_4_ + fVar147;
    local_8a0._12_4_ = auVar87._12_4_ + fVar148;
    local_8a0._16_4_ = fVar149 + 0.0;
    local_8a0._20_4_ = fVar150 + 0.0;
    local_8a0._24_4_ = fVar151 + 0.0;
    local_8a0._28_4_ = auVar144._28_4_ + 0.0;
    local_880 = ZEXT1632(auVar87);
    auVar144 = vsubps_avx(local_880,auVar10);
    local_6e0 = vpermps_avx2(_DAT_0205d4a0,auVar144);
    _local_700 = vpermps_avx2(_DAT_0205d4a0,local_880);
    auVar144 = vmaxps_avx(local_880,local_8a0);
    auVar100 = vmaxps_avx(local_6e0,_local_700);
    auVar12 = vrsqrtps_avx(ZEXT1632(auVar194));
    auVar144 = vmaxps_avx(auVar144,auVar100);
    fVar114 = auVar12._0_4_;
    fVar146 = auVar12._4_4_;
    fVar151 = auVar12._8_4_;
    fVar147 = auVar12._12_4_;
    fVar148 = auVar12._16_4_;
    fVar149 = auVar12._20_4_;
    fVar150 = auVar12._24_4_;
    auVar18._4_4_ = fVar146 * fVar146 * fVar146 * auVar194._4_4_ * -0.5;
    auVar18._0_4_ = fVar114 * fVar114 * fVar114 * auVar194._0_4_ * -0.5;
    auVar18._8_4_ = fVar151 * fVar151 * fVar151 * auVar194._8_4_ * -0.5;
    auVar18._12_4_ = fVar147 * fVar147 * fVar147 * auVar194._12_4_ * -0.5;
    auVar18._16_4_ = fVar148 * fVar148 * fVar148 * -0.0;
    auVar18._20_4_ = fVar149 * fVar149 * fVar149 * -0.0;
    auVar18._24_4_ = fVar150 * fVar150 * fVar150 * -0.0;
    auVar18._28_4_ = local_940._28_4_;
    auVar101._8_4_ = 0x3fc00000;
    auVar101._0_8_ = 0x3fc000003fc00000;
    auVar101._12_4_ = 0x3fc00000;
    auVar101._16_4_ = 0x3fc00000;
    auVar101._20_4_ = 0x3fc00000;
    auVar101._24_4_ = 0x3fc00000;
    auVar101._28_4_ = 0x3fc00000;
    auVar96 = vfmadd231ps_fma(auVar18,auVar101,auVar12);
    auVar253 = ZEXT1664(auVar96);
    fVar146 = auVar96._0_4_;
    fVar151 = auVar96._4_4_;
    auVar19._4_4_ = fVar204 * fVar151;
    auVar19._0_4_ = fVar190 * fVar146;
    fVar148 = auVar96._8_4_;
    auVar19._8_4_ = fVar205 * fVar148;
    fVar150 = auVar96._12_4_;
    auVar19._12_4_ = fVar206 * fVar150;
    auVar19._16_4_ = fVar207 * 0.0;
    auVar19._20_4_ = fVar259 * 0.0;
    auVar19._24_4_ = fVar260 * 0.0;
    auVar19._28_4_ = 0;
    auVar20._4_4_ = fStack_65c * fVar151 * fVar164;
    auVar20._0_4_ = local_660 * fVar146 * fVar163;
    auVar20._8_4_ = fStack_658 * fVar148 * fVar165;
    auVar20._12_4_ = fStack_654 * fVar150 * fVar166;
    auVar20._16_4_ = fStack_650 * fVar208 * 0.0;
    auVar20._20_4_ = fStack_64c * fVar209 * 0.0;
    auVar20._24_4_ = fStack_648 * fVar232 * 0.0;
    auVar20._28_4_ = local_5a0._28_4_;
    auVar96 = vfmadd231ps_fma(auVar20,auVar19,_local_640);
    local_6a0 = ZEXT1632(auVar116);
    auVar157 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar100 = vsubps_avx(auVar157,local_6a0);
    fVar190 = auVar100._0_4_;
    auVar273._0_4_ = fVar190 * fVar146 * fVar163;
    fVar204 = auVar100._4_4_;
    auVar273._4_4_ = fVar204 * fVar151 * fVar164;
    fVar205 = auVar100._8_4_;
    auVar273._8_4_ = fVar205 * fVar148 * fVar165;
    fVar206 = auVar100._12_4_;
    auVar273._12_4_ = fVar206 * fVar150 * fVar166;
    fVar207 = auVar100._16_4_;
    auVar273._16_4_ = fVar207 * fVar208 * 0.0;
    fVar208 = auVar100._20_4_;
    auVar273._20_4_ = fVar208 * fVar209 * 0.0;
    fVar209 = auVar100._24_4_;
    auVar273._24_4_ = fVar209 * fVar232 * 0.0;
    auVar273._28_4_ = 0;
    auVar157 = vsubps_avx(auVar157,local_ae0);
    auVar194 = vfmadd231ps_fma(auVar273,auVar157,auVar19);
    auVar21._4_4_ = fVar281 * fVar151;
    auVar21._0_4_ = fVar261 * fVar146;
    auVar21._8_4_ = fVar282 * fVar148;
    auVar21._12_4_ = fVar283 * fVar150;
    auVar21._16_4_ = fVar284 * 0.0;
    auVar21._20_4_ = fVar285 * 0.0;
    auVar21._24_4_ = fVar286 * 0.0;
    auVar21._28_4_ = auVar12._28_4_;
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar21,_local_620);
    auVar257 = ZEXT1664(auVar96);
    auVar186 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar229 = vsubps_avx(auVar186,local_ac0);
    auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),auVar229,auVar21);
    auVar22._4_4_ = fStack_65c * fVar204;
    auVar22._0_4_ = local_660 * fVar190;
    auVar22._8_4_ = fStack_658 * fVar205;
    auVar22._12_4_ = fStack_654 * fVar206;
    auVar22._16_4_ = fStack_650 * fVar207;
    auVar22._20_4_ = fStack_64c * fVar208;
    auVar22._24_4_ = fStack_648 * fVar209;
    auVar22._28_4_ = auVar12._28_4_;
    auVar218 = vfmadd231ps_fma(auVar22,_local_640,auVar157);
    auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),_local_620,auVar229);
    fVar114 = auVar194._0_4_;
    fVar232 = auVar96._0_4_;
    fVar147 = auVar194._4_4_;
    fVar259 = auVar96._4_4_;
    fVar149 = auVar194._8_4_;
    fVar260 = auVar96._8_4_;
    fVar163 = auVar194._12_4_;
    fVar261 = auVar96._12_4_;
    auVar23._28_4_ = local_620._28_4_;
    auVar23._0_28_ =
         ZEXT1628(CONCAT412(fVar261 * fVar163,
                            CONCAT48(fVar260 * fVar149,CONCAT44(fVar259 * fVar147,fVar232 * fVar114)
                                    )));
    auVar12 = vsubps_avx(ZEXT1632(auVar218),auVar23);
    auVar24._4_4_ = fVar204 * fVar204;
    auVar24._0_4_ = fVar190 * fVar190;
    auVar24._8_4_ = fVar205 * fVar205;
    auVar24._12_4_ = fVar206 * fVar206;
    auVar24._16_4_ = fVar207 * fVar207;
    auVar24._20_4_ = fVar208 * fVar208;
    auVar24._24_4_ = fVar209 * fVar209;
    auVar24._28_4_ = local_620._28_4_;
    auVar218 = vfmadd231ps_fma(auVar24,auVar157,auVar157);
    auVar218 = vfmadd231ps_fma(ZEXT1632(auVar218),auVar229,auVar229);
    auVar25._28_4_ = fStack_644;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar163 * fVar163,
                            CONCAT48(fVar149 * fVar149,CONCAT44(fVar147 * fVar147,fVar114 * fVar114)
                                    )));
    local_720 = vsubps_avx(ZEXT1632(auVar218),auVar25);
    local_680 = vsqrtps_avx(auVar108);
    fVar114 = (auVar144._0_4_ + local_680._0_4_) * 1.0000002;
    fVar147 = (auVar144._4_4_ + local_680._4_4_) * 1.0000002;
    fVar149 = (auVar144._8_4_ + local_680._8_4_) * 1.0000002;
    fVar163 = (auVar144._12_4_ + local_680._12_4_) * 1.0000002;
    fVar164 = (auVar144._16_4_ + local_680._16_4_) * 1.0000002;
    fVar165 = (auVar144._20_4_ + local_680._20_4_) * 1.0000002;
    fVar166 = (auVar144._24_4_ + local_680._24_4_) * 1.0000002;
    auVar26._4_4_ = fVar147 * fVar147;
    auVar26._0_4_ = fVar114 * fVar114;
    auVar26._8_4_ = fVar149 * fVar149;
    auVar26._12_4_ = fVar163 * fVar163;
    auVar26._16_4_ = fVar164 * fVar164;
    auVar26._20_4_ = fVar165 * fVar165;
    auVar26._24_4_ = fVar166 * fVar166;
    auVar26._28_4_ = auVar144._28_4_ + local_680._28_4_;
    local_a00._0_4_ = auVar12._0_4_ + auVar12._0_4_;
    local_a00._4_4_ = auVar12._4_4_ + auVar12._4_4_;
    local_a00._8_4_ = auVar12._8_4_ + auVar12._8_4_;
    local_a00._12_4_ = auVar12._12_4_ + auVar12._12_4_;
    local_a00._16_4_ = auVar12._16_4_ + auVar12._16_4_;
    local_a00._20_4_ = auVar12._20_4_ + auVar12._20_4_;
    local_a00._24_4_ = auVar12._24_4_ + auVar12._24_4_;
    fVar114 = auVar12._28_4_;
    local_a00._28_4_ = fVar114 + fVar114;
    auVar12 = vsubps_avx(local_720,auVar26);
    auVar256 = ZEXT1632(auVar96);
    fStack_5a4 = (float)local_580._28_4_;
    _local_5c0 = ZEXT1628(CONCAT412(fVar261 * fVar261,
                                    CONCAT48(fVar260 * fVar260,
                                             CONCAT44(fVar259 * fVar259,fVar232 * fVar232))));
    local_aa0 = vsubps_avx(local_2e0,_local_5c0);
    local_760._4_4_ = local_a00._4_4_ * local_a00._4_4_;
    local_760._0_4_ = local_a00._0_4_ * local_a00._0_4_;
    local_760._8_4_ = local_a00._8_4_ * local_a00._8_4_;
    local_760._12_4_ = local_a00._12_4_ * local_a00._12_4_;
    local_760._16_4_ = local_a00._16_4_ * local_a00._16_4_;
    local_760._20_4_ = local_a00._20_4_ * local_a00._20_4_;
    local_760._24_4_ = local_a00._24_4_ * local_a00._24_4_;
    local_760._28_4_ = fVar114;
    fVar147 = local_aa0._0_4_;
    local_560 = fVar147 * 4.0;
    fVar149 = local_aa0._4_4_;
    fStack_55c = fVar149 * 4.0;
    fVar163 = local_aa0._8_4_;
    fStack_558 = fVar163 * 4.0;
    fVar164 = local_aa0._12_4_;
    fStack_554 = fVar164 * 4.0;
    fVar165 = local_aa0._16_4_;
    fStack_550 = fVar165 * 4.0;
    fVar166 = local_aa0._20_4_;
    fStack_54c = fVar166 * 4.0;
    fVar232 = local_aa0._24_4_;
    fStack_548 = fVar232 * 4.0;
    fStack_544 = 4.0;
    auVar27._4_4_ = auVar12._4_4_ * fStack_55c;
    auVar27._0_4_ = auVar12._0_4_ * local_560;
    auVar27._8_4_ = auVar12._8_4_ * fStack_558;
    auVar27._12_4_ = auVar12._12_4_ * fStack_554;
    auVar27._16_4_ = auVar12._16_4_ * fStack_550;
    auVar27._20_4_ = auVar12._20_4_ * fStack_54c;
    auVar27._24_4_ = auVar12._24_4_ * fStack_548;
    auVar27._28_4_ = 0x40800000;
    auVar144 = vsubps_avx(local_760,auVar27);
    auVar108 = vcmpps_avx(auVar144,auVar186,5);
    auVar274 = ZEXT1632(auVar194);
    fVar114 = local_aa0._28_4_;
    if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar108 >> 0x7f,0) == '\0') &&
          (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar108 >> 0xbf,0) == '\0') &&
        (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar108[0x1f])
    {
      auVar263._8_4_ = 0x7f800000;
      auVar263._0_8_ = 0x7f8000007f800000;
      auVar263._12_4_ = 0x7f800000;
      auVar263._16_4_ = 0x7f800000;
      auVar263._20_4_ = 0x7f800000;
      auVar263._24_4_ = 0x7f800000;
      auVar263._28_4_ = 0x7f800000;
      auVar242._8_4_ = 0xff800000;
      auVar242._0_8_ = 0xff800000ff800000;
      auVar242._12_4_ = 0xff800000;
      auVar242._16_4_ = 0xff800000;
      auVar242._20_4_ = 0xff800000;
      auVar242._24_4_ = 0xff800000;
      auVar242._28_4_ = 0xff800000;
      auVar8 = local_720;
    }
    else {
      auVar11 = vsqrtps_avx(auVar144);
      auVar264._0_4_ = fVar147 + fVar147;
      auVar264._4_4_ = fVar149 + fVar149;
      auVar264._8_4_ = fVar163 + fVar163;
      auVar264._12_4_ = fVar164 + fVar164;
      auVar264._16_4_ = fVar165 + fVar165;
      auVar264._20_4_ = fVar166 + fVar166;
      auVar264._24_4_ = fVar232 + fVar232;
      auVar264._28_4_ = fVar114 + fVar114;
      auVar10 = vrcpps_avx(auVar264);
      auVar144 = vcmpps_avx(auVar144,auVar186,5);
      auVar102._8_4_ = 0x3f800000;
      auVar102._0_8_ = &DAT_3f8000003f800000;
      auVar102._12_4_ = 0x3f800000;
      auVar102._16_4_ = 0x3f800000;
      auVar102._20_4_ = 0x3f800000;
      auVar102._24_4_ = 0x3f800000;
      auVar102._28_4_ = 0x3f800000;
      auVar96 = vfnmadd213ps_fma(auVar264,auVar10,auVar102);
      auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar10,auVar10);
      uVar80 = CONCAT44(local_a00._4_4_,local_a00._0_4_);
      auVar103._0_8_ = uVar80 ^ 0x8000000080000000;
      auVar103._8_4_ = -local_a00._8_4_;
      auVar103._12_4_ = -local_a00._12_4_;
      auVar103._16_4_ = -local_a00._16_4_;
      auVar103._20_4_ = -local_a00._20_4_;
      auVar103._24_4_ = -local_a00._24_4_;
      auVar103._28_4_ = -local_a00._28_4_;
      auVar186 = vsubps_avx(auVar103,auVar11);
      auVar28._4_4_ = auVar96._4_4_ * auVar186._4_4_;
      auVar28._0_4_ = auVar96._0_4_ * auVar186._0_4_;
      auVar28._8_4_ = auVar96._8_4_ * auVar186._8_4_;
      auVar28._12_4_ = auVar96._12_4_ * auVar186._12_4_;
      auVar28._16_4_ = auVar186._16_4_ * 0.0;
      auVar28._20_4_ = auVar186._20_4_ * 0.0;
      auVar28._24_4_ = auVar186._24_4_ * 0.0;
      auVar28._28_4_ = auVar186._28_4_;
      auVar186 = vsubps_avx(auVar11,local_a00);
      auVar8._4_4_ = auVar96._4_4_ * auVar186._4_4_;
      auVar8._0_4_ = auVar96._0_4_ * auVar186._0_4_;
      auVar8._8_4_ = auVar96._8_4_ * auVar186._8_4_;
      auVar8._12_4_ = auVar96._12_4_ * auVar186._12_4_;
      auVar8._16_4_ = auVar186._16_4_ * 0.0;
      auVar8._20_4_ = auVar186._20_4_ * 0.0;
      auVar8._24_4_ = auVar186._24_4_ * 0.0;
      auVar8._28_4_ = auVar10._28_4_;
      auVar96 = vfmadd213ps_fma(auVar256,auVar28,auVar274);
      local_520 = ZEXT1632(CONCAT412(fVar150 * auVar96._12_4_,
                                     CONCAT48(fVar148 * auVar96._8_4_,
                                              CONCAT44(fVar151 * auVar96._4_4_,
                                                       fVar146 * auVar96._0_4_))));
      auVar96 = vfmadd213ps_fma(auVar256,auVar8,auVar274);
      local_540 = ZEXT1632(CONCAT412(fVar150 * auVar96._12_4_,
                                     CONCAT48(fVar148 * auVar96._8_4_,
                                              CONCAT44(fVar151 * auVar96._4_4_,
                                                       fVar146 * auVar96._0_4_))));
      auVar228._8_4_ = 0x7f800000;
      auVar228._0_8_ = 0x7f8000007f800000;
      auVar228._12_4_ = 0x7f800000;
      auVar228._16_4_ = 0x7f800000;
      auVar228._20_4_ = 0x7f800000;
      auVar228._24_4_ = 0x7f800000;
      auVar228._28_4_ = 0x7f800000;
      auVar263 = vblendvps_avx(auVar228,auVar28,auVar144);
      auVar60._4_4_ = uStack_77c;
      auVar60._0_4_ = local_780;
      auVar60._8_4_ = uStack_778;
      auVar60._12_4_ = uStack_774;
      auVar60._16_4_ = uStack_770;
      auVar60._20_4_ = uStack_76c;
      auVar60._24_4_ = uStack_768;
      auVar60._28_4_ = uStack_764;
      auVar186 = vandps_avx(_local_5c0,auVar60);
      auVar186 = vmaxps_avx(local_440,auVar186);
      auVar29._4_4_ = auVar186._4_4_ * 1.9073486e-06;
      auVar29._0_4_ = auVar186._0_4_ * 1.9073486e-06;
      auVar29._8_4_ = auVar186._8_4_ * 1.9073486e-06;
      auVar29._12_4_ = auVar186._12_4_ * 1.9073486e-06;
      auVar29._16_4_ = auVar186._16_4_ * 1.9073486e-06;
      auVar29._20_4_ = auVar186._20_4_ * 1.9073486e-06;
      auVar29._24_4_ = auVar186._24_4_ * 1.9073486e-06;
      auVar29._28_4_ = auVar186._28_4_;
      auVar186 = vandps_avx(local_aa0,auVar60);
      auVar186 = vcmpps_avx(auVar186,auVar29,1);
      auVar104._8_4_ = 0xff800000;
      auVar104._0_8_ = 0xff800000ff800000;
      auVar104._12_4_ = 0xff800000;
      auVar104._16_4_ = 0xff800000;
      auVar104._20_4_ = 0xff800000;
      auVar104._24_4_ = 0xff800000;
      auVar104._28_4_ = 0xff800000;
      auVar242 = vblendvps_avx(auVar104,auVar8,auVar144);
      auVar10 = auVar144 & auVar186;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar108 = vandps_avx(auVar186,auVar144);
        auVar186 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,2);
        auVar270._8_4_ = 0xff800000;
        auVar270._0_8_ = 0xff800000ff800000;
        auVar270._12_4_ = 0xff800000;
        auVar270._16_4_ = 0xff800000;
        auVar270._20_4_ = 0xff800000;
        auVar270._24_4_ = 0xff800000;
        auVar270._28_4_ = 0xff800000;
        auVar287._8_4_ = 0x7f800000;
        auVar287._0_8_ = 0x7f8000007f800000;
        auVar287._12_4_ = 0x7f800000;
        auVar287._16_4_ = 0x7f800000;
        auVar287._20_4_ = 0x7f800000;
        auVar287._24_4_ = 0x7f800000;
        auVar287._28_4_ = 0x7f800000;
        auVar12 = vblendvps_avx(auVar287,auVar270,auVar186);
        auVar96 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
        auVar10 = vpmovsxwd_avx2(auVar96);
        auVar263 = vblendvps_avx(auVar263,auVar12,auVar10);
        auVar8 = vblendvps_avx(auVar270,auVar287,auVar186);
        auVar242 = vblendvps_avx(auVar242,auVar8,auVar10);
        auVar112._0_8_ = auVar108._0_8_ ^ 0xffffffffffffffff;
        auVar112._8_4_ = auVar108._8_4_ ^ 0xffffffff;
        auVar112._12_4_ = auVar108._12_4_ ^ 0xffffffff;
        auVar112._16_4_ = auVar108._16_4_ ^ 0xffffffff;
        auVar112._20_4_ = auVar108._20_4_ ^ 0xffffffff;
        auVar112._24_4_ = auVar108._24_4_ ^ 0xffffffff;
        auVar112._28_4_ = auVar108._28_4_ ^ 0xffffffff;
        auVar108 = vorps_avx(auVar186,auVar112);
        auVar108 = vandps_avx(auVar144,auVar108);
      }
    }
    auVar266 = ZEXT3264(auVar263);
    auVar246 = ZEXT3264(auVar242);
    auVar237 = ZEXT3264(auVar8);
    auVar225 = ZEXT3264(auVar144);
    auVar144 = local_380 & auVar108;
    if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar144 >> 0x7f,0) != '\0') ||
          (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar144 >> 0xbf,0) != '\0') ||
        (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar144[0x1f] < '\0') {
      fVar259 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7a0._0_4_;
      auVar105._4_4_ = fVar259;
      auVar105._0_4_ = fVar259;
      auVar105._8_4_ = fVar259;
      auVar105._12_4_ = fVar259;
      auVar105._16_4_ = fVar259;
      auVar105._20_4_ = fVar259;
      auVar105._24_4_ = fVar259;
      auVar105._28_4_ = fVar259;
      local_960 = vmaxps_avx(auVar105,auVar263);
      fVar259 = (ray->super_RayK<1>).tfar - (float)local_7a0._0_4_;
      auVar221._4_4_ = fVar259;
      auVar221._0_4_ = fVar259;
      auVar221._8_4_ = fVar259;
      auVar221._12_4_ = fVar259;
      auVar221._16_4_ = fVar259;
      auVar221._20_4_ = fVar259;
      auVar221._24_4_ = fVar259;
      auVar221._28_4_ = fVar259;
      auVar30._4_4_ = fVar204 * local_840._4_4_;
      auVar30._0_4_ = fVar190 * (float)local_840._0_4_;
      auVar30._8_4_ = fVar205 * local_840._8_4_;
      auVar30._12_4_ = fVar206 * local_840._12_4_;
      auVar30._16_4_ = fVar207 * local_840._16_4_;
      auVar30._20_4_ = fVar208 * local_840._20_4_;
      auVar30._24_4_ = fVar209 * local_840._24_4_;
      auVar30._28_4_ = auVar100._28_4_;
      auVar96 = vfmadd213ps_fma(auVar157,local_820,auVar30);
      auVar194 = vfmadd213ps_fma(auVar229,local_900,ZEXT1632(auVar96));
      auVar31._4_4_ = local_840._4_4_ * fStack_65c;
      auVar31._0_4_ = (float)local_840._0_4_ * local_660;
      auVar31._8_4_ = local_840._8_4_ * fStack_658;
      auVar31._12_4_ = local_840._12_4_ * fStack_654;
      auVar31._16_4_ = local_840._16_4_ * fStack_650;
      auVar31._20_4_ = local_840._20_4_ * fStack_64c;
      auVar31._24_4_ = local_840._24_4_ * fStack_648;
      auVar31._28_4_ = 0;
      auVar96 = vfmadd231ps_fma(auVar31,local_820,_local_640);
      auVar218 = vfmadd231ps_fma(ZEXT1632(auVar96),local_900,_local_620);
      auVar61._4_4_ = uStack_77c;
      auVar61._0_4_ = local_780;
      auVar61._8_4_ = uStack_778;
      auVar61._12_4_ = uStack_774;
      auVar61._16_4_ = uStack_770;
      auVar61._20_4_ = uStack_76c;
      auVar61._24_4_ = uStack_768;
      auVar61._28_4_ = uStack_764;
      auVar144 = vandps_avx(auVar61,ZEXT1632(auVar218));
      auVar106._8_4_ = 0x219392ef;
      auVar106._0_8_ = 0x219392ef219392ef;
      auVar106._12_4_ = 0x219392ef;
      auVar106._16_4_ = 0x219392ef;
      auVar106._20_4_ = 0x219392ef;
      auVar106._24_4_ = 0x219392ef;
      auVar106._28_4_ = 0x219392ef;
      auVar100 = vcmpps_avx(auVar144,auVar106,1);
      auVar243._8_4_ = 0x80000000;
      auVar243._0_8_ = 0x8000000080000000;
      auVar243._12_4_ = 0x80000000;
      auVar243._16_4_ = 0x80000000;
      auVar243._20_4_ = 0x80000000;
      auVar243._24_4_ = 0x80000000;
      auVar243._28_4_ = 0x80000000;
      auVar246 = ZEXT3264(auVar243);
      auVar144 = vrcpps_avx(ZEXT1632(auVar218));
      auVar280._8_4_ = 0x3f800000;
      auVar280._0_8_ = &DAT_3f8000003f800000;
      auVar280._12_4_ = 0x3f800000;
      auVar280._16_4_ = 0x3f800000;
      auVar280._20_4_ = 0x3f800000;
      auVar280._24_4_ = 0x3f800000;
      auVar280._28_4_ = 0x3f800000;
      auVar229 = ZEXT1632(auVar218);
      auVar96 = vfnmadd213ps_fma(auVar144,auVar229,auVar280);
      auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar144,auVar144);
      auVar183._0_8_ = auVar218._0_8_ ^ 0x8000000080000000;
      auVar183._8_4_ = auVar218._8_4_ ^ 0x80000000;
      auVar183._12_4_ = auVar218._12_4_ ^ 0x80000000;
      auVar183._16_4_ = 0x80000000;
      auVar183._20_4_ = 0x80000000;
      auVar183._24_4_ = 0x80000000;
      auVar183._28_4_ = 0x80000000;
      auVar265._0_4_ = auVar96._0_4_ * -auVar194._0_4_;
      auVar265._4_4_ = auVar96._4_4_ * -auVar194._4_4_;
      auVar265._8_4_ = auVar96._8_4_ * -auVar194._8_4_;
      auVar265._12_4_ = auVar96._12_4_ * -auVar194._12_4_;
      auVar265._16_4_ = 0x80000000;
      auVar265._20_4_ = 0x80000000;
      auVar265._24_4_ = 0x80000000;
      auVar265._28_4_ = 0;
      auVar144 = vcmpps_avx(auVar229,auVar183,1);
      auVar144 = vorps_avx(auVar100,auVar144);
      auVar107._8_4_ = 0xff800000;
      auVar107._0_8_ = 0xff800000ff800000;
      auVar107._12_4_ = 0xff800000;
      auVar107._16_4_ = 0xff800000;
      auVar107._20_4_ = 0xff800000;
      auVar107._24_4_ = 0xff800000;
      auVar107._28_4_ = 0xff800000;
      auVar144 = vblendvps_avx(auVar265,auVar107,auVar144);
      auVar157 = vminps_avx(auVar221,auVar242);
      auVar12 = vmaxps_avx(local_960,auVar144);
      auVar144 = vcmpps_avx(auVar229,auVar183,6);
      auVar144 = vorps_avx(auVar100,auVar144);
      auVar184._8_4_ = 0x7f800000;
      auVar184._0_8_ = 0x7f8000007f800000;
      auVar184._12_4_ = 0x7f800000;
      auVar184._16_4_ = 0x7f800000;
      auVar184._20_4_ = 0x7f800000;
      auVar184._24_4_ = 0x7f800000;
      auVar184._28_4_ = 0x7f800000;
      auVar144 = vblendvps_avx(auVar265,auVar184,auVar144);
      auVar157 = vminps_avx(auVar157,auVar144);
      auVar144 = vsubps_avx(ZEXT832(0) << 0x20,_local_8e0);
      auVar100 = vsubps_avx(ZEXT832(0) << 0x20,local_7e0);
      auVar32._4_4_ = auVar100._4_4_ * fVar247;
      auVar32._0_4_ = auVar100._0_4_ * fVar85;
      auVar32._8_4_ = auVar100._8_4_ * fVar248;
      auVar32._12_4_ = auVar100._12_4_ * fVar249;
      auVar32._16_4_ = auVar100._16_4_ * fVar288;
      auVar32._20_4_ = auVar100._20_4_ * fVar289;
      auVar32._24_4_ = auVar100._24_4_ * fVar290;
      auVar32._28_4_ = auVar100._28_4_;
      auVar96 = vfnmsub231ps_fma(auVar32,local_940,auVar144);
      auVar144 = vsubps_avx(ZEXT832(0) << 0x20,_local_9c0);
      auVar194 = vfnmadd231ps_fma(ZEXT1632(auVar96),local_920,auVar144);
      auVar33._4_4_ = fVar247 * fStack_65c;
      auVar33._0_4_ = fVar85 * local_660;
      auVar33._8_4_ = fVar248 * fStack_658;
      auVar33._12_4_ = fVar249 * fStack_654;
      auVar33._16_4_ = fVar288 * fStack_650;
      auVar33._20_4_ = fVar289 * fStack_64c;
      auVar33._24_4_ = fVar290 * fStack_648;
      auVar33._28_4_ = auVar144._28_4_;
      auVar96 = vfnmsub231ps_fma(auVar33,local_940,_local_640);
      auVar218 = vfnmadd231ps_fma(ZEXT1632(auVar96),local_920,_local_620);
      auVar144 = vandps_avx(auVar61,ZEXT1632(auVar218));
      auVar229 = vrcpps_avx(ZEXT1632(auVar218));
      auVar199._8_4_ = 0x219392ef;
      auVar199._0_8_ = 0x219392ef219392ef;
      auVar199._12_4_ = 0x219392ef;
      auVar199._16_4_ = 0x219392ef;
      auVar199._20_4_ = 0x219392ef;
      auVar199._24_4_ = 0x219392ef;
      auVar199._28_4_ = 0x219392ef;
      auVar100 = vcmpps_avx(auVar144,auVar199,1);
      auVar186 = ZEXT1632(auVar218);
      auVar96 = vfnmadd213ps_fma(auVar229,auVar186,auVar280);
      auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar229,auVar229);
      auVar236._0_8_ = auVar218._0_8_ ^ 0x8000000080000000;
      auVar236._8_4_ = auVar218._8_4_ ^ 0x80000000;
      auVar236._12_4_ = auVar218._12_4_ ^ 0x80000000;
      auVar236._16_4_ = 0x80000000;
      auVar236._20_4_ = 0x80000000;
      auVar236._24_4_ = 0x80000000;
      auVar236._28_4_ = 0x80000000;
      auVar237 = ZEXT3264(auVar236);
      auVar34._4_4_ = auVar96._4_4_ * -auVar194._4_4_;
      auVar34._0_4_ = auVar96._0_4_ * -auVar194._0_4_;
      auVar34._8_4_ = auVar96._8_4_ * -auVar194._8_4_;
      auVar34._12_4_ = auVar96._12_4_ * -auVar194._12_4_;
      auVar34._16_4_ = 0x80000000;
      auVar34._20_4_ = 0x80000000;
      auVar34._24_4_ = 0x80000000;
      auVar34._28_4_ = 0x80000000;
      auVar225 = ZEXT3264(auVar34);
      auVar144 = vcmpps_avx(auVar186,auVar236,1);
      auVar144 = vorps_avx(auVar144,auVar100);
      auVar200._8_4_ = 0xff800000;
      auVar200._0_8_ = 0xff800000ff800000;
      auVar200._12_4_ = 0xff800000;
      auVar200._16_4_ = 0xff800000;
      auVar200._20_4_ = 0xff800000;
      auVar200._24_4_ = 0xff800000;
      auVar200._28_4_ = 0xff800000;
      auVar144 = vblendvps_avx(auVar34,auVar200,auVar144);
      auVar266 = ZEXT3264(auVar144);
      local_960 = vmaxps_avx(auVar12,auVar144);
      auVar144 = vcmpps_avx(auVar186,auVar236,6);
      auVar144 = vorps_avx(auVar100,auVar144);
      auVar185._8_4_ = 0x7f800000;
      auVar185._0_8_ = 0x7f8000007f800000;
      auVar185._12_4_ = 0x7f800000;
      auVar185._16_4_ = 0x7f800000;
      auVar185._20_4_ = 0x7f800000;
      auVar185._24_4_ = 0x7f800000;
      auVar185._28_4_ = 0x7f800000;
      auVar144 = vblendvps_avx(auVar34,auVar185,auVar144);
      auVar108 = vandps_avx(local_380,auVar108);
      local_4c0 = vminps_avx(auVar157,auVar144);
      auVar144 = vcmpps_avx(local_960,local_4c0,2);
      auVar100 = auVar108 & auVar144;
      if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar100 >> 0x7f,0) != '\0') ||
            (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar100 >> 0xbf,0) != '\0') ||
          (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar100[0x1f] < '\0') {
        _local_9c0 = auVar243;
        auVar100 = vminps_avx(local_520,auVar280);
        auVar198 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar100 = vmaxps_avx(auVar100,ZEXT832(0) << 0x20);
        auVar12 = vminps_avx(local_540,auVar280);
        auVar12 = vmaxps_avx(auVar12,ZEXT832(0) << 0x20);
        auVar35._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
        auVar35._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
        auVar35._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
        auVar35._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
        auVar35._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
        auVar35._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
        auVar35._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
        auVar35._28_4_ = auVar100._28_4_ + 7.0;
        auVar96 = vfmadd213ps_fma(auVar35,local_860,local_800);
        auVar36._4_4_ = (auVar12._4_4_ + 1.0) * 0.125;
        auVar36._0_4_ = (auVar12._0_4_ + 0.0) * 0.125;
        auVar36._8_4_ = (auVar12._8_4_ + 2.0) * 0.125;
        auVar36._12_4_ = (auVar12._12_4_ + 3.0) * 0.125;
        auVar36._16_4_ = (auVar12._16_4_ + 4.0) * 0.125;
        auVar36._20_4_ = (auVar12._20_4_ + 5.0) * 0.125;
        auVar36._24_4_ = (auVar12._24_4_ + 6.0) * 0.125;
        auVar36._28_4_ = auVar12._28_4_ + 7.0;
        auVar194 = vfmadd213ps_fma(auVar36,local_860,local_800);
        auVar100 = vminps_avx(local_880,local_8a0);
        auVar12 = vminps_avx(local_6e0,_local_700);
        auVar100 = vminps_avx(auVar100,auVar12);
        auVar100 = vsubps_avx(auVar100,local_680);
        auVar108 = vandps_avx(auVar144,auVar108);
        local_520 = ZEXT1632(auVar96);
        local_540 = ZEXT1632(auVar194);
        auVar37._4_4_ = auVar100._4_4_ * 0.99999976;
        auVar37._0_4_ = auVar100._0_4_ * 0.99999976;
        auVar37._8_4_ = auVar100._8_4_ * 0.99999976;
        auVar37._12_4_ = auVar100._12_4_ * 0.99999976;
        auVar37._16_4_ = auVar100._16_4_ * 0.99999976;
        auVar37._20_4_ = auVar100._20_4_ * 0.99999976;
        auVar37._24_4_ = auVar100._24_4_ * 0.99999976;
        auVar37._28_4_ = 0x3f7ffffc;
        auVar144 = vmaxps_avx(ZEXT832(0) << 0x20,auVar37);
        auVar38._4_4_ = auVar144._4_4_ * auVar144._4_4_;
        auVar38._0_4_ = auVar144._0_4_ * auVar144._0_4_;
        auVar38._8_4_ = auVar144._8_4_ * auVar144._8_4_;
        auVar38._12_4_ = auVar144._12_4_ * auVar144._12_4_;
        auVar38._16_4_ = auVar144._16_4_ * auVar144._16_4_;
        auVar38._20_4_ = auVar144._20_4_ * auVar144._20_4_;
        auVar38._24_4_ = auVar144._24_4_ * auVar144._24_4_;
        auVar38._28_4_ = auVar144._28_4_;
        auVar100 = vsubps_avx(local_720,auVar38);
        auVar266 = ZEXT3264(auVar100);
        auVar39._4_4_ = auVar100._4_4_ * fStack_55c;
        auVar39._0_4_ = auVar100._0_4_ * local_560;
        auVar39._8_4_ = auVar100._8_4_ * fStack_558;
        auVar39._12_4_ = auVar100._12_4_ * fStack_554;
        auVar39._16_4_ = auVar100._16_4_ * fStack_550;
        auVar39._20_4_ = auVar100._20_4_ * fStack_54c;
        auVar39._24_4_ = auVar100._24_4_ * fStack_548;
        auVar39._28_4_ = auVar144._28_4_;
        auVar12 = vsubps_avx(local_760,auVar39);
        auVar51 = ZEXT412(0);
        auVar157 = ZEXT1232(auVar51) << 0x20;
        local_460 = ZEXT1232(auVar51) << 0x20;
        auVar144 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,5);
        if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar144 >> 0x7f,0) == '\0') &&
              (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar144 >> 0xbf,0) == '\0') &&
            (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar144[0x1f]) {
          local_6a0 = ZEXT1232(auVar51) << 0x20;
          _local_6c0 = ZEXT1232(auVar51) << 0x20;
          auVar186 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar222._8_4_ = 0x7f800000;
          auVar222._0_8_ = 0x7f8000007f800000;
          auVar222._12_4_ = 0x7f800000;
          auVar222._16_4_ = 0x7f800000;
          auVar222._20_4_ = 0x7f800000;
          auVar222._24_4_ = 0x7f800000;
          auVar222._28_4_ = 0x7f800000;
          auVar230._8_4_ = 0xff800000;
          auVar230._0_8_ = 0xff800000ff800000;
          auVar230._12_4_ = 0xff800000;
          auVar230._16_4_ = 0xff800000;
          auVar230._20_4_ = 0xff800000;
          auVar230._24_4_ = 0xff800000;
          auVar230._28_4_ = 0xff800000;
        }
        else {
          _local_8e0 = auVar144;
          auVar158._0_4_ = fVar147 + fVar147;
          auVar158._4_4_ = fVar149 + fVar149;
          auVar158._8_4_ = fVar163 + fVar163;
          auVar158._12_4_ = fVar164 + fVar164;
          auVar158._16_4_ = fVar165 + fVar165;
          auVar158._20_4_ = fVar166 + fVar166;
          auVar158._24_4_ = fVar232 + fVar232;
          auVar158._28_4_ = fVar114 + fVar114;
          auVar157 = vrcpps_avx(auVar158);
          auVar96 = vfnmadd213ps_fma(auVar158,auVar157,auVar280);
          auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar157,auVar157);
          auVar157 = vsqrtps_avx(auVar12);
          uVar80 = CONCAT44(local_a00._4_4_,local_a00._0_4_);
          auVar201._0_8_ = uVar80 ^ 0x8000000080000000;
          auVar201._8_4_ = -local_a00._8_4_;
          auVar201._12_4_ = -local_a00._12_4_;
          auVar201._16_4_ = -local_a00._16_4_;
          auVar201._20_4_ = -local_a00._20_4_;
          auVar201._24_4_ = -local_a00._24_4_;
          auVar201._28_4_ = -local_a00._28_4_;
          auVar229 = vsubps_avx(auVar201,auVar157);
          auVar157 = vsubps_avx(auVar157,local_a00);
          fVar163 = auVar229._0_4_ * auVar96._0_4_;
          fVar288 = auVar229._4_4_ * auVar96._4_4_;
          auVar40._4_4_ = fVar288;
          auVar40._0_4_ = fVar163;
          fVar289 = auVar229._8_4_ * auVar96._8_4_;
          auVar40._8_4_ = fVar289;
          fVar290 = auVar229._12_4_ * auVar96._12_4_;
          auVar40._12_4_ = fVar290;
          fVar164 = auVar229._16_4_ * 0.0;
          auVar40._16_4_ = fVar164;
          fVar165 = auVar229._20_4_ * 0.0;
          auVar40._20_4_ = fVar165;
          fVar166 = auVar229._24_4_ * 0.0;
          auVar40._24_4_ = fVar166;
          auVar40._28_4_ = auVar144._28_4_;
          fVar114 = auVar157._0_4_ * auVar96._0_4_;
          fVar85 = auVar157._4_4_ * auVar96._4_4_;
          auVar41._4_4_ = fVar85;
          auVar41._0_4_ = fVar114;
          fVar247 = auVar157._8_4_ * auVar96._8_4_;
          auVar41._8_4_ = fVar247;
          fVar147 = auVar157._12_4_ * auVar96._12_4_;
          auVar41._12_4_ = fVar147;
          fVar248 = auVar157._16_4_ * 0.0;
          auVar41._16_4_ = fVar248;
          fVar149 = auVar157._20_4_ * 0.0;
          auVar41._20_4_ = fVar149;
          fVar249 = auVar157._24_4_ * 0.0;
          auVar41._24_4_ = fVar249;
          auVar41._28_4_ = 0x80000000;
          auVar96 = vfmadd213ps_fma(auVar256,auVar40,auVar274);
          auVar194 = vfmadd213ps_fma(auVar256,auVar41,auVar274);
          auVar42._28_4_ = auVar229._28_4_;
          auVar42._0_28_ =
               ZEXT1628(CONCAT412(fVar150 * auVar96._12_4_,
                                  CONCAT48(fVar148 * auVar96._8_4_,
                                           CONCAT44(fVar151 * auVar96._4_4_,fVar146 * auVar96._0_4_)
                                          )));
          auVar157 = ZEXT1632(CONCAT412(fVar150 * auVar194._12_4_,
                                        CONCAT48(fVar148 * auVar194._8_4_,
                                                 CONCAT44(fVar151 * auVar194._4_4_,
                                                          fVar146 * auVar194._0_4_))));
          auVar96 = vfmadd213ps_fma(local_580,auVar42,local_ac0);
          auVar194 = vfmadd213ps_fma(local_580,auVar157,local_ac0);
          auVar218 = vfmadd213ps_fma(local_5a0,auVar42,local_ae0);
          auVar124 = vfmadd213ps_fma(local_5a0,auVar157,local_ae0);
          auVar9 = vfmadd213ps_fma(auVar42,_local_6c0,local_6a0);
          auVar272 = vfmadd213ps_fma(_local_6c0,auVar157,local_6a0);
          auVar43._4_4_ = fVar288 * (float)local_620._4_4_;
          auVar43._0_4_ = fVar163 * (float)local_620._0_4_;
          auVar43._8_4_ = fVar289 * fStack_618;
          auVar43._12_4_ = fVar290 * fStack_614;
          auVar43._16_4_ = fVar164 * fStack_610;
          auVar43._20_4_ = fVar165 * fStack_60c;
          auVar43._24_4_ = fVar166 * fStack_608;
          auVar43._28_4_ = 0;
          auVar157 = vsubps_avx(auVar43,ZEXT1632(auVar96));
          auVar187._0_4_ = fVar163 * (float)local_640._0_4_;
          auVar187._4_4_ = fVar288 * (float)local_640._4_4_;
          auVar187._8_4_ = fVar289 * fStack_638;
          auVar187._12_4_ = fVar290 * fStack_634;
          auVar187._16_4_ = fVar164 * fStack_630;
          auVar187._20_4_ = fVar165 * fStack_62c;
          auVar187._24_4_ = fVar166 * fStack_628;
          auVar187._28_4_ = 0;
          auVar186 = vsubps_avx(auVar187,ZEXT1632(auVar218));
          auVar223._0_4_ = local_660 * fVar163;
          auVar223._4_4_ = fStack_65c * fVar288;
          auVar223._8_4_ = fStack_658 * fVar289;
          auVar223._12_4_ = fStack_654 * fVar290;
          auVar223._16_4_ = fStack_650 * fVar164;
          auVar223._20_4_ = fStack_64c * fVar165;
          auVar223._24_4_ = fStack_648 * fVar166;
          auVar223._28_4_ = 0;
          auVar229 = vsubps_avx(auVar223,ZEXT1632(auVar9));
          auVar198 = auVar229._0_28_;
          auVar44._4_4_ = fVar85 * (float)local_620._4_4_;
          auVar44._0_4_ = fVar114 * (float)local_620._0_4_;
          auVar44._8_4_ = fVar247 * fStack_618;
          auVar44._12_4_ = fVar147 * fStack_614;
          auVar44._16_4_ = fVar248 * fStack_610;
          auVar44._20_4_ = fVar149 * fStack_60c;
          auVar44._24_4_ = fVar249 * fStack_608;
          auVar44._28_4_ = 0;
          local_460 = vsubps_avx(auVar44,ZEXT1632(auVar194));
          auVar45._4_4_ = fVar85 * (float)local_640._4_4_;
          auVar45._0_4_ = fVar114 * (float)local_640._0_4_;
          auVar45._8_4_ = fVar247 * fStack_638;
          auVar45._12_4_ = fVar147 * fStack_634;
          auVar45._16_4_ = fVar248 * fStack_630;
          auVar45._20_4_ = fVar149 * fStack_62c;
          auVar45._24_4_ = fVar249 * fStack_628;
          auVar45._28_4_ = local_460._28_4_;
          local_6a0 = vsubps_avx(auVar45,ZEXT1632(auVar124));
          auVar46._4_4_ = fStack_65c * fVar85;
          auVar46._0_4_ = local_660 * fVar114;
          auVar46._8_4_ = fStack_658 * fVar247;
          auVar46._12_4_ = fStack_654 * fVar147;
          auVar46._16_4_ = fStack_650 * fVar248;
          auVar46._20_4_ = fStack_64c * fVar149;
          auVar46._24_4_ = fStack_648 * fVar249;
          auVar46._28_4_ = local_6a0._28_4_;
          _local_6c0 = vsubps_avx(auVar46,ZEXT1632(auVar272));
          auVar229 = vcmpps_avx(auVar12,_DAT_02020f00,5);
          auVar224._8_4_ = 0x7f800000;
          auVar224._0_8_ = 0x7f8000007f800000;
          auVar224._12_4_ = 0x7f800000;
          auVar224._16_4_ = 0x7f800000;
          auVar224._20_4_ = 0x7f800000;
          auVar224._24_4_ = 0x7f800000;
          auVar224._28_4_ = 0x7f800000;
          auVar222 = vblendvps_avx(auVar224,auVar40,auVar229);
          auVar62._4_4_ = uStack_77c;
          auVar62._0_4_ = local_780;
          auVar62._8_4_ = uStack_778;
          auVar62._12_4_ = uStack_774;
          auVar62._16_4_ = uStack_770;
          auVar62._20_4_ = uStack_76c;
          auVar62._24_4_ = uStack_768;
          auVar62._28_4_ = uStack_764;
          auVar12 = vandps_avx(auVar62,_local_5c0);
          auVar12 = vmaxps_avx(local_440,auVar12);
          auVar47._4_4_ = auVar12._4_4_ * 1.9073486e-06;
          auVar47._0_4_ = auVar12._0_4_ * 1.9073486e-06;
          auVar47._8_4_ = auVar12._8_4_ * 1.9073486e-06;
          auVar47._12_4_ = auVar12._12_4_ * 1.9073486e-06;
          auVar47._16_4_ = auVar12._16_4_ * 1.9073486e-06;
          auVar47._20_4_ = auVar12._20_4_ * 1.9073486e-06;
          auVar47._24_4_ = auVar12._24_4_ * 1.9073486e-06;
          auVar47._28_4_ = auVar12._28_4_;
          auVar12 = vandps_avx(auVar62,local_aa0);
          auVar12 = vcmpps_avx(auVar12,auVar47,1);
          auVar231._8_4_ = 0xff800000;
          auVar231._0_8_ = 0xff800000ff800000;
          auVar231._12_4_ = 0xff800000;
          auVar231._16_4_ = 0xff800000;
          auVar231._20_4_ = 0xff800000;
          auVar231._24_4_ = 0xff800000;
          auVar231._28_4_ = 0xff800000;
          auVar230 = vblendvps_avx(auVar231,auVar41,auVar229);
          auVar256 = auVar229 & auVar12;
          if ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar256 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar256 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar256 >> 0x7f,0) != '\0') ||
                (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar256 >> 0xbf,0) != '\0') ||
              (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar256[0x1f] < '\0') {
            auVar144 = vandps_avx(auVar12,auVar229);
            auVar12 = vcmpps_avx(auVar100,ZEXT832(0) << 0x20,2);
            auVar271._8_4_ = 0xff800000;
            auVar271._0_8_ = 0xff800000ff800000;
            auVar271._12_4_ = 0xff800000;
            auVar271._16_4_ = 0xff800000;
            auVar271._20_4_ = 0xff800000;
            auVar271._24_4_ = 0xff800000;
            auVar271._28_4_ = 0xff800000;
            auVar275._8_4_ = 0x7f800000;
            auVar275._0_8_ = 0x7f8000007f800000;
            auVar275._12_4_ = 0x7f800000;
            auVar275._16_4_ = 0x7f800000;
            auVar275._20_4_ = 0x7f800000;
            auVar275._24_4_ = 0x7f800000;
            auVar275._28_4_ = 0x7f800000;
            auVar100 = vblendvps_avx(auVar275,auVar271,auVar12);
            auVar96 = vpackssdw_avx(auVar144._0_16_,auVar144._16_16_);
            auVar256 = vpmovsxwd_avx2(auVar96);
            auVar222 = vblendvps_avx(auVar222,auVar100,auVar256);
            auVar100 = vblendvps_avx(auVar271,auVar275,auVar12);
            auVar266 = ZEXT3264(auVar100);
            auVar230 = vblendvps_avx(auVar230,auVar100,auVar256);
            auVar245._0_8_ = auVar144._0_8_ ^ 0xffffffffffffffff;
            auVar245._8_4_ = auVar144._8_4_ ^ 0xffffffff;
            auVar245._12_4_ = auVar144._12_4_ ^ 0xffffffff;
            auVar245._16_4_ = auVar144._16_4_ ^ 0xffffffff;
            auVar245._20_4_ = auVar144._20_4_ ^ 0xffffffff;
            auVar245._24_4_ = auVar144._24_4_ ^ 0xffffffff;
            auVar245._28_4_ = auVar144._28_4_ ^ 0xffffffff;
            auVar144 = vorps_avx(auVar12,auVar245);
            auVar144 = vandps_avx(auVar144,auVar229);
          }
        }
        uVar81 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
        auVar244._4_4_ = uVar81;
        auVar244._0_4_ = uVar81;
        auVar244._8_4_ = uVar81;
        auVar244._12_4_ = uVar81;
        auVar244._16_4_ = uVar81;
        auVar244._20_4_ = uVar81;
        auVar244._24_4_ = uVar81;
        auVar244._28_4_ = uVar81;
        auVar246 = ZEXT3264(auVar244);
        uVar81 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
        auVar252._4_4_ = uVar81;
        auVar252._0_4_ = uVar81;
        auVar252._8_4_ = uVar81;
        auVar252._12_4_ = uVar81;
        auVar252._16_4_ = uVar81;
        auVar252._20_4_ = uVar81;
        auVar252._24_4_ = uVar81;
        auVar252._28_4_ = uVar81;
        auVar253 = ZEXT3264(auVar252);
        fVar114 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar269._4_4_ = fVar114;
        auVar269._0_4_ = fVar114;
        auVar269._8_4_ = fVar114;
        auVar269._12_4_ = fVar114;
        auVar269._16_4_ = fVar114;
        auVar269._20_4_ = fVar114;
        auVar269._24_4_ = fVar114;
        auVar269._28_4_ = fVar114;
        local_4a0 = local_960;
        local_480 = vminps_avx(local_4c0,auVar222);
        _local_4e0 = vmaxps_avx(local_960,auVar230);
        auVar257 = ZEXT3264(_local_4e0);
        auVar100 = vcmpps_avx(local_960,local_480,2);
        local_580 = vandps_avx(auVar100,auVar108);
        auVar225 = ZEXT3264(local_580);
        local_5e0 = local_580;
        auVar100 = vcmpps_avx(_local_4e0,local_4c0,2);
        local_600 = vandps_avx(auVar100,auVar108);
        auVar237 = ZEXT3264(local_600);
        auVar108 = vorps_avx(local_600,local_580);
        if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar108 >> 0x7f,0) != '\0') ||
              (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar108 >> 0xbf,0) != '\0') ||
            (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar108[0x1f] < '\0') {
          local_3a0 = local_600;
          _local_5c0 = _local_4e0;
          local_3c0._0_8_ = auVar144._0_8_ ^ 0xffffffffffffffff;
          local_3c0._8_4_ = auVar144._8_4_ ^ 0xffffffff;
          local_3c0._12_4_ = auVar144._12_4_ ^ 0xffffffff;
          local_3c0._16_4_ = auVar144._16_4_ ^ 0xffffffff;
          local_3c0._20_4_ = auVar144._20_4_ ^ 0xffffffff;
          local_3c0._24_4_ = auVar144._24_4_ ^ 0xffffffff;
          local_3c0._28_4_ = auVar144._28_4_ ^ 0xffffffff;
          auVar225 = ZEXT3264(local_3c0);
          auVar266 = ZEXT3264(auVar269);
          auVar48._4_4_ = fVar114 * auVar198._4_4_;
          auVar48._0_4_ = fVar114 * auVar198._0_4_;
          auVar48._8_4_ = fVar114 * auVar198._8_4_;
          auVar48._12_4_ = fVar114 * auVar198._12_4_;
          auVar48._16_4_ = fVar114 * auVar198._16_4_;
          auVar48._20_4_ = fVar114 * auVar198._20_4_;
          auVar48._24_4_ = fVar114 * auVar198._24_4_;
          auVar48._28_4_ = auVar108._28_4_;
          auVar257 = ZEXT3264(auVar252);
          auVar96 = vfmadd213ps_fma(auVar186,auVar252,auVar48);
          auVar253 = ZEXT3264(auVar244);
          auVar96 = vfmadd213ps_fma(auVar157,auVar244,ZEXT1632(auVar96));
          auVar63._4_4_ = uStack_77c;
          auVar63._0_4_ = local_780;
          auVar63._8_4_ = uStack_778;
          auVar63._12_4_ = uStack_774;
          auVar63._16_4_ = uStack_770;
          auVar63._20_4_ = uStack_76c;
          auVar63._24_4_ = uStack_768;
          auVar63._28_4_ = uStack_764;
          auVar108 = vandps_avx(ZEXT1632(auVar96),auVar63);
          auVar135._8_4_ = 0x3e99999a;
          auVar135._0_8_ = 0x3e99999a3e99999a;
          auVar135._12_4_ = 0x3e99999a;
          auVar135._16_4_ = 0x3e99999a;
          auVar135._20_4_ = 0x3e99999a;
          auVar135._24_4_ = 0x3e99999a;
          auVar135._28_4_ = 0x3e99999a;
          auVar108 = vcmpps_avx(auVar108,auVar135,1);
          auVar108 = vorps_avx(auVar108,local_3c0);
          auVar136._8_4_ = 3;
          auVar136._0_8_ = 0x300000003;
          auVar136._12_4_ = 3;
          auVar136._16_4_ = 3;
          auVar136._20_4_ = 3;
          auVar136._24_4_ = 3;
          auVar136._28_4_ = 3;
          auVar159._8_4_ = 2;
          auVar159._0_8_ = 0x200000002;
          auVar159._12_4_ = 2;
          auVar159._16_4_ = 2;
          auVar159._20_4_ = 2;
          auVar159._24_4_ = 2;
          auVar159._28_4_ = 2;
          auVar108 = vblendvps_avx(auVar159,auVar136,auVar108);
          uVar81 = (undefined4)uVar82;
          local_3e0._4_4_ = uVar81;
          local_3e0._0_4_ = uVar81;
          local_3e0._8_4_ = uVar81;
          local_3e0._12_4_ = uVar81;
          local_3e0._16_4_ = uVar81;
          local_3e0._20_4_ = uVar81;
          local_3e0._24_4_ = uVar81;
          local_3e0._28_4_ = uVar81;
          local_5a0 = vpcmpgtd_avx2(auVar108,local_3e0);
          local_5e0 = vpandn_avx2(local_5a0,local_580);
          auVar203 = ZEXT3264(local_5e0);
          auVar108 = local_580 & ~local_5a0;
          local_680._0_8_ = uVar82;
          if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar108 >> 0x7f,0) != '\0') ||
                (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar108 >> 0xbf,0) != '\0') ||
              (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar108[0x1f] < '\0') {
            auVar194 = vminps_avx(local_a10,local_a30);
            auVar96 = vmaxps_avx(local_a10,local_a30);
            auVar218 = vminps_avx(local_a20,_local_a40);
            auVar124 = vminps_avx(auVar194,auVar218);
            auVar194 = vmaxps_avx(local_a20,_local_a40);
            auVar218 = vmaxps_avx(auVar96,auVar194);
            auVar96 = vandps_avx(auVar124,local_8b0);
            auVar194 = vandps_avx(auVar218,local_8b0);
            auVar96 = vmaxps_avx(auVar96,auVar194);
            auVar194 = vmovshdup_avx(auVar96);
            auVar194 = vmaxss_avx(auVar194,auVar96);
            auVar96 = vshufpd_avx(auVar96,auVar96,1);
            auVar96 = vmaxss_avx(auVar96,auVar194);
            local_900._4_24_ = auVar227._4_24_;
            local_900._0_4_ = auVar96._0_4_ * 1.9073486e-06;
            local_900._28_4_ = 0;
            auVar96 = vshufps_avx(auVar218,auVar218,0xff);
            local_760._0_16_ = auVar96;
            local_560 = local_960._0_4_ + (float)local_740._0_4_;
            fStack_55c = local_960._4_4_ + (float)local_740._4_4_;
            fStack_558 = local_960._8_4_ + fStack_738;
            fStack_554 = local_960._12_4_ + fStack_734;
            fStack_550 = local_960._16_4_ + fStack_730;
            fStack_54c = local_960._20_4_ + fStack_72c;
            fStack_548 = local_960._24_4_ + fStack_728;
            fStack_544 = local_960._28_4_ + fStack_724;
            local_860 = auVar244;
            local_880 = auVar252;
            local_8a0 = auVar269;
            do {
              auVar137._8_4_ = 0x7f800000;
              auVar137._0_8_ = 0x7f8000007f800000;
              auVar137._12_4_ = 0x7f800000;
              auVar137._16_4_ = 0x7f800000;
              auVar137._20_4_ = 0x7f800000;
              auVar137._24_4_ = 0x7f800000;
              auVar137._28_4_ = 0x7f800000;
              auVar108 = auVar203._0_32_;
              auVar144 = vblendvps_avx(auVar137,local_960,auVar108);
              auVar100 = vshufps_avx(auVar144,auVar144,0xb1);
              auVar100 = vminps_avx(auVar144,auVar100);
              auVar12 = vshufpd_avx(auVar100,auVar100,5);
              auVar100 = vminps_avx(auVar100,auVar12);
              auVar12 = vpermpd_avx2(auVar100,0x4e);
              auVar100 = vminps_avx(auVar100,auVar12);
              auVar144 = vcmpps_avx(auVar144,auVar100,0);
              auVar100 = auVar108 & auVar144;
              if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar100 >> 0x7f,0) != '\0') ||
                    (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar100 >> 0xbf,0) != '\0') ||
                  (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar100[0x1f] < '\0') {
                auVar108 = vandps_avx(auVar144,auVar108);
              }
              uVar78 = vmovmskps_avx(auVar108);
              iVar13 = 0;
              for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                iVar13 = iVar13 + 1;
              }
              uVar78 = iVar13 << 2;
              *(undefined4 *)(local_5e0 + uVar78) = 0;
              aVar2 = (ray->super_RayK<1>).dir.field_0;
              local_7e0._0_16_ = (undefined1  [16])aVar2;
              auVar96 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              auVar203 = ZEXT464(*(uint *)(local_520 + uVar78));
              if (auVar96._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_520 + uVar78));
                local_ac0._0_16_ = ZEXT416((uint)*(float *)(local_4a0 + uVar78));
                fVar85 = sqrtf(auVar96._0_4_);
                auVar203 = ZEXT1664(local_ae0._0_16_);
                fVar114 = (float)local_ac0._0_4_;
                uVar81 = local_ac0._4_4_;
                uVar276 = local_ac0._8_4_;
                uVar277 = local_ac0._12_4_;
              }
              else {
                auVar96 = vsqrtss_avx(auVar96,auVar96);
                fVar85 = auVar96._0_4_;
                fVar114 = *(float *)(local_4a0 + uVar78);
                uVar81 = 0;
                uVar276 = 0;
                uVar277 = 0;
              }
              local_800._0_4_ = fVar85 * 1.9073486e-06;
              lVar83 = 4;
              do {
                auVar108 = local_ac0;
                fVar146 = auVar203._0_4_;
                fVar85 = 1.0 - fVar146;
                auVar118._0_4_ = local_a30._0_4_ * fVar146;
                auVar118._4_4_ = local_a30._4_4_ * fVar146;
                auVar118._8_4_ = local_a30._8_4_ * fVar146;
                auVar118._12_4_ = local_a30._12_4_ * fVar146;
                auVar152._4_4_ = fVar85;
                auVar152._0_4_ = fVar85;
                auVar152._8_4_ = fVar85;
                auVar152._12_4_ = fVar85;
                auVar96 = vfmadd231ps_fma(auVar118,auVar152,local_a10);
                auVar168._0_4_ = local_a20._0_4_ * fVar146;
                auVar168._4_4_ = local_a20._4_4_ * fVar146;
                auVar168._8_4_ = local_a20._8_4_ * fVar146;
                auVar168._12_4_ = local_a20._12_4_ * fVar146;
                auVar194 = vfmadd231ps_fma(auVar168,auVar152,local_a30);
                auVar215._0_4_ = fVar146 * auVar194._0_4_;
                auVar215._4_4_ = fVar146 * auVar194._4_4_;
                auVar215._8_4_ = fVar146 * auVar194._8_4_;
                auVar215._12_4_ = fVar146 * auVar194._12_4_;
                local_820._0_16_ = vfmadd231ps_fma(auVar215,auVar152,auVar96);
                auVar119._0_4_ = fVar146 * (float)local_a40._0_4_;
                auVar119._4_4_ = fVar146 * (float)local_a40._4_4_;
                auVar119._8_4_ = fVar146 * fStack_a38;
                auVar119._12_4_ = fVar146 * fStack_a34;
                auVar96 = vfmadd231ps_fma(auVar119,auVar152,local_a20);
                auVar193._0_4_ = fVar146 * auVar96._0_4_;
                auVar193._4_4_ = fVar146 * auVar96._4_4_;
                auVar193._8_4_ = fVar146 * auVar96._8_4_;
                auVar193._12_4_ = fVar146 * auVar96._12_4_;
                auVar194 = vfmadd231ps_fma(auVar193,auVar152,auVar194);
                auVar120._4_4_ = fVar114;
                auVar120._0_4_ = fVar114;
                auVar120._8_4_ = fVar114;
                auVar120._12_4_ = fVar114;
                auVar96 = vfmadd213ps_fma(auVar120,local_7e0._0_16_,_DAT_01feba10);
                auVar92._0_4_ = fVar146 * auVar194._0_4_;
                auVar92._4_4_ = fVar146 * auVar194._4_4_;
                auVar92._8_4_ = fVar146 * auVar194._8_4_;
                auVar92._12_4_ = fVar146 * auVar194._12_4_;
                auVar218 = vfmadd231ps_fma(auVar92,local_820._0_16_,auVar152);
                local_840._0_16_ = auVar218;
                auVar96 = vsubps_avx(auVar96,auVar218);
                _local_8e0 = auVar96;
                auVar96 = vdpps_avx(auVar96,auVar96,0x7f);
                local_ae0._0_16_ = auVar203._0_16_;
                local_ac0._4_4_ = uVar81;
                local_ac0._0_4_ = fVar114;
                local_ac0._8_4_ = uVar276;
                local_ac0._16_16_ = auVar108._16_16_;
                local_ac0._12_4_ = uVar277;
                local_aa0._0_16_ = auVar96;
                if (auVar96._0_4_ < 0.0) {
                  _local_9c0 = ZEXT416((uint)fVar85);
                  local_920._0_16_ = auVar194;
                  auVar203._0_4_ = sqrtf(auVar96._0_4_);
                  auVar203._4_60_ = extraout_var;
                  auVar96 = auVar203._0_16_;
                  auVar194 = local_920._0_16_;
                  auVar218 = _local_9c0;
                  auVar124 = local_ae0._0_16_;
                  fVar114 = (float)local_ac0._0_4_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar96,auVar96);
                  auVar218 = ZEXT416((uint)fVar85);
                  auVar124 = auVar203._0_16_;
                }
                auVar194 = vsubps_avx(auVar194,local_820._0_16_);
                local_820._0_4_ = auVar194._0_4_ * 3.0;
                local_820._4_4_ = auVar194._4_4_ * 3.0;
                local_820._8_4_ = auVar194._8_4_ * 3.0;
                local_820._12_4_ = auVar194._12_4_ * 3.0;
                auVar194 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar218,auVar124);
                auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar124,auVar218);
                fVar85 = auVar218._0_4_ * 6.0;
                fVar146 = auVar194._0_4_ * 6.0;
                fVar247 = auVar9._0_4_ * 6.0;
                fVar151 = auVar124._0_4_ * 6.0;
                auVar169._0_4_ = fVar151 * (float)local_a40._0_4_;
                auVar169._4_4_ = fVar151 * (float)local_a40._4_4_;
                auVar169._8_4_ = fVar151 * fStack_a38;
                auVar169._12_4_ = fVar151 * fStack_a34;
                auVar121._4_4_ = fVar247;
                auVar121._0_4_ = fVar247;
                auVar121._8_4_ = fVar247;
                auVar121._12_4_ = fVar247;
                auVar194 = vfmadd132ps_fma(auVar121,auVar169,local_a20);
                auVar170._4_4_ = fVar146;
                auVar170._0_4_ = fVar146;
                auVar170._8_4_ = fVar146;
                auVar170._12_4_ = fVar146;
                auVar194 = vfmadd132ps_fma(auVar170,auVar194,local_a30);
                auVar218 = vdpps_avx(local_820._0_16_,local_820._0_16_,0x7f);
                auVar122._4_4_ = fVar85;
                auVar122._0_4_ = fVar85;
                auVar122._8_4_ = fVar85;
                auVar122._12_4_ = fVar85;
                auVar9 = vfmadd132ps_fma(auVar122,auVar194,local_a10);
                auVar194 = vblendps_avx(auVar218,_DAT_01feba10,0xe);
                auVar124 = vrsqrtss_avx(auVar194,auVar194);
                fVar247 = auVar218._0_4_;
                fVar85 = auVar124._0_4_;
                auVar124 = vdpps_avx(local_820._0_16_,auVar9,0x7f);
                fVar85 = fVar85 * 1.5 + fVar247 * -0.5 * fVar85 * fVar85 * fVar85;
                auVar123._0_4_ = auVar9._0_4_ * fVar247;
                auVar123._4_4_ = auVar9._4_4_ * fVar247;
                auVar123._8_4_ = auVar9._8_4_ * fVar247;
                auVar123._12_4_ = auVar9._12_4_ * fVar247;
                fVar146 = auVar124._0_4_;
                auVar216._0_4_ = local_820._0_4_ * fVar146;
                auVar216._4_4_ = local_820._4_4_ * fVar146;
                auVar216._8_4_ = local_820._8_4_ * fVar146;
                auVar216._12_4_ = local_820._12_4_ * fVar146;
                auVar124 = vsubps_avx(auVar123,auVar216);
                auVar194 = vrcpss_avx(auVar194,auVar194);
                auVar9 = vfnmadd213ss_fma(auVar194,auVar218,ZEXT416(0x40000000));
                fVar146 = auVar194._0_4_ * auVar9._0_4_;
                auVar194 = vmaxss_avx(ZEXT416((uint)local_900._0_4_),
                                      ZEXT416((uint)(fVar114 * (float)local_800._0_4_)));
                local_9c0._0_4_ = auVar194._0_4_;
                uVar82 = CONCAT44(local_820._4_4_,local_820._0_4_);
                auVar251._0_8_ = uVar82 ^ 0x8000000080000000;
                auVar251._8_4_ = -local_820._8_4_;
                auVar251._12_4_ = -local_820._12_4_;
                local_a00._0_4_ = fVar85 * auVar124._0_4_ * fVar146;
                local_a00._4_4_ = fVar85 * auVar124._4_4_ * fVar146;
                local_a00._8_4_ = fVar85 * auVar124._8_4_ * fVar146;
                local_a00._12_4_ = fVar85 * auVar124._12_4_ * fVar146;
                local_940._0_4_ = local_820._0_4_ * fVar85;
                local_940._4_4_ = local_820._4_4_ * fVar85;
                local_940._8_4_ = local_820._8_4_ * fVar85;
                local_940._12_4_ = local_820._12_4_ * fVar85;
                if (fVar247 < -fVar247) {
                  local_920._0_4_ = auVar96._0_4_;
                  local_9e0._0_16_ = auVar251;
                  fVar114 = sqrtf(fVar247);
                  auVar96 = ZEXT416((uint)local_920._0_4_);
                  auVar251 = local_9e0._0_16_;
                }
                else {
                  auVar194 = vsqrtss_avx(auVar218,auVar218);
                  fVar114 = auVar194._0_4_;
                }
                local_920._0_16_ = vdpps_avx(_local_8e0,local_940._0_16_,0x7f);
                auVar9 = vfmadd213ss_fma(ZEXT416((uint)local_900._0_4_),auVar96,
                                         ZEXT416((uint)local_9c0._0_4_));
                auVar194 = vdpps_avx(auVar251,local_940._0_16_,0x7f);
                auVar218 = vdpps_avx(_local_8e0,local_a00._0_16_,0x7f);
                auVar124 = vdpps_avx(local_7e0._0_16_,local_940._0_16_,0x7f);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)(auVar96._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_900._0_4_ / fVar114)),auVar9);
                local_9e0._0_4_ = auVar96._0_4_;
                auVar93._0_4_ = local_920._0_4_ * local_920._0_4_;
                auVar93._4_4_ = local_920._4_4_ * local_920._4_4_;
                auVar93._8_4_ = local_920._8_4_ * local_920._8_4_;
                auVar93._12_4_ = local_920._12_4_ * local_920._12_4_;
                auVar96 = vdpps_avx(_local_8e0,auVar251,0x7f);
                auVar272 = vsubps_avx(local_aa0._0_16_,auVar93);
                auVar9 = vrsqrtss_avx(auVar272,auVar272);
                fVar85 = auVar272._0_4_;
                fVar114 = auVar9._0_4_;
                fVar114 = fVar114 * 1.5 + fVar85 * -0.5 * fVar114 * fVar114 * fVar114;
                auVar9 = vdpps_avx(_local_8e0,local_7e0._0_16_,0x7f);
                local_940._0_16_ = ZEXT416((uint)(auVar194._0_4_ + auVar218._0_4_));
                local_a00._0_16_ = vfnmadd231ss_fma(auVar96,local_920._0_16_,local_940._0_16_);
                auVar96 = vfnmadd231ss_fma(auVar9,local_920._0_16_,auVar124);
                if (fVar85 < 0.0) {
                  local_6e0._0_16_ = auVar124;
                  local_700._0_4_ = fVar114;
                  local_720._0_16_ = auVar96;
                  fVar85 = sqrtf(fVar85);
                  fVar114 = (float)local_700._0_4_;
                  auVar96 = local_720._0_16_;
                  auVar124 = local_6e0._0_16_;
                }
                else {
                  auVar194 = vsqrtss_avx(auVar272,auVar272);
                  fVar85 = auVar194._0_4_;
                }
                auVar253 = ZEXT3264(local_860);
                auVar257 = ZEXT3264(local_880);
                auVar266 = ZEXT3264(local_8a0);
                auVar194 = vpermilps_avx(local_840._0_16_,0xff);
                auVar9 = vshufps_avx(local_820._0_16_,local_820._0_16_,0xff);
                auVar218 = vfmsub213ss_fma(local_a00._0_16_,ZEXT416((uint)fVar114),auVar9);
                auVar171._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
                auVar171._8_4_ = auVar124._8_4_ ^ 0x80000000;
                auVar171._12_4_ = auVar124._12_4_ ^ 0x80000000;
                auVar195._0_8_ = auVar218._0_8_ ^ 0x8000000080000000;
                auVar195._8_4_ = auVar218._8_4_ ^ 0x80000000;
                auVar195._12_4_ = auVar218._12_4_ ^ 0x80000000;
                auVar237 = ZEXT1664(local_940._0_16_);
                auVar96 = ZEXT416((uint)(auVar96._0_4_ * fVar114));
                auVar218 = vfmsub231ss_fma(ZEXT416((uint)(auVar124._0_4_ * auVar218._0_4_)),
                                           local_940._0_16_,auVar96);
                auVar96 = vinsertps_avx(auVar96,auVar171,0x10);
                uVar81 = auVar218._0_4_;
                auVar172._4_4_ = uVar81;
                auVar172._0_4_ = uVar81;
                auVar172._8_4_ = uVar81;
                auVar172._12_4_ = uVar81;
                auVar96 = vdivps_avx(auVar96,auVar172);
                auVar246 = ZEXT1664(local_920._0_16_);
                auVar124 = ZEXT416((uint)(fVar85 - auVar194._0_4_));
                auVar218 = vinsertps_avx(local_920._0_16_,auVar124,0x10);
                auVar225 = ZEXT1664(auVar218);
                auVar153._0_4_ = auVar218._0_4_ * auVar96._0_4_;
                auVar153._4_4_ = auVar218._4_4_ * auVar96._4_4_;
                auVar153._8_4_ = auVar218._8_4_ * auVar96._8_4_;
                auVar153._12_4_ = auVar218._12_4_ * auVar96._12_4_;
                auVar96 = vinsertps_avx(auVar195,local_940._0_16_,0x1c);
                auVar96 = vdivps_avx(auVar96,auVar172);
                auVar173._0_4_ = auVar218._0_4_ * auVar96._0_4_;
                auVar173._4_4_ = auVar218._4_4_ * auVar96._4_4_;
                auVar173._8_4_ = auVar218._8_4_ * auVar96._8_4_;
                auVar173._12_4_ = auVar218._12_4_ * auVar96._12_4_;
                auVar96 = vhaddps_avx(auVar153,auVar153);
                auVar194 = vhaddps_avx(auVar173,auVar173);
                fVar85 = (float)local_ae0._0_4_ - auVar96._0_4_;
                auVar203 = ZEXT464((uint)fVar85);
                fVar114 = (float)local_ac0._0_4_ - auVar194._0_4_;
                uVar81 = 0;
                uVar276 = 0;
                uVar277 = 0;
                auVar96 = vandps_avx(local_920._0_16_,local_8b0);
                if ((float)local_9e0._0_4_ <= auVar96._0_4_) {
LAB_016895a1:
                  bVar49 = false;
                }
                else {
                  auVar194 = vfmadd231ss_fma(ZEXT416((uint)((float)local_9e0._0_4_ +
                                                           (float)local_9c0._0_4_)),local_760._0_16_
                                             ,ZEXT416(0x36000000));
                  auVar96 = vandps_avx(auVar124,local_8b0);
                  if (auVar194._0_4_ <= auVar96._0_4_) goto LAB_016895a1;
                  fVar114 = fVar114 + (float)local_7a0._0_4_;
                  uVar81 = 0;
                  uVar276 = 0;
                  uVar277 = 0;
                  bVar49 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar114) &&
                       (fVar146 = (ray->super_RayK<1>).tfar, fVar114 <= fVar146)) && (0.0 <= fVar85)
                      ) && (fVar85 <= 1.0)) {
                    auVar96 = vrsqrtss_avx(local_aa0._0_16_,local_aa0._0_16_);
                    fVar247 = auVar96._0_4_;
                    pGVar5 = (context->scene->geometries).items[local_ae8].ptr;
                    if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar247 = fVar247 * 1.5 + local_aa0._0_4_ * -0.5 * fVar247 * fVar247 * fVar247
                      ;
                      auVar125._0_4_ = fVar247 * (float)local_8e0._0_4_;
                      auVar125._4_4_ = fVar247 * (float)local_8e0._4_4_;
                      auVar125._8_4_ = fVar247 * fStack_8d8;
                      auVar125._12_4_ = fVar247 * fStack_8d4;
                      auVar9 = vfmadd213ps_fma(auVar9,auVar125,local_820._0_16_);
                      auVar96 = vshufps_avx(auVar125,auVar125,0xc9);
                      auVar194 = vshufps_avx(local_820._0_16_,local_820._0_16_,0xc9);
                      auVar126._0_4_ = auVar125._0_4_ * auVar194._0_4_;
                      auVar126._4_4_ = auVar125._4_4_ * auVar194._4_4_;
                      auVar126._8_4_ = auVar125._8_4_ * auVar194._8_4_;
                      auVar126._12_4_ = auVar125._12_4_ * auVar194._12_4_;
                      auVar124 = vfmsub231ps_fma(auVar126,local_820._0_16_,auVar96);
                      auVar96 = vshufps_avx(auVar124,auVar124,0xc9);
                      auVar194 = vshufps_avx(auVar9,auVar9,0xc9);
                      auVar124 = vshufps_avx(auVar124,auVar124,0xd2);
                      auVar94._0_4_ = auVar9._0_4_ * auVar124._0_4_;
                      auVar94._4_4_ = auVar9._4_4_ * auVar124._4_4_;
                      auVar94._8_4_ = auVar9._8_4_ * auVar124._8_4_;
                      auVar94._12_4_ = auVar9._12_4_ * auVar124._12_4_;
                      auVar96 = vfmsub231ps_fma(auVar94,auVar96,auVar194);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar114;
                        auVar194 = vshufps_avx(auVar96,auVar96,0xe9);
                        uVar1 = vmovlps_avx(auVar194);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar1;
                        (ray->Ng).field_0.field_0.z = auVar96._0_4_;
                        ray->u = fVar85;
                        ray->v = 0.0;
                        ray->primID = (uint)local_a78;
                        ray->geomID = (uint)local_ae8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar194 = vshufps_avx(auVar96,auVar96,0xe9);
                        local_990 = vmovlps_avx(auVar194);
                        local_988 = auVar96._0_4_;
                        local_984 = fVar85;
                        local_980 = 0;
                        local_97c = (uint)local_a78;
                        local_978 = (uint)local_ae8;
                        local_974 = context->user->instID[0];
                        local_970 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar114;
                        local_aec = -1;
                        local_a70.valid = &local_aec;
                        local_a70.geometryUserPtr = pGVar5->userPtr;
                        local_a70.context = context->user;
                        local_a70.ray = (RTCRayN *)ray;
                        local_a70.hit = (RTCHitN *)&local_990;
                        local_a70.N = 1;
                        local_ae0._0_16_ = ZEXT416((uint)fVar85);
                        local_ac0._0_16_ = ZEXT416((uint)fVar114);
                        local_aa0._0_4_ = fVar146;
                        if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016896ef:
                          p_Var7 = context->args->filter;
                          if (p_Var7 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                              auVar225 = ZEXT1664(auVar225._0_16_);
                              auVar237 = ZEXT1664(auVar237._0_16_);
                              auVar246 = ZEXT1664(auVar246._0_16_);
                              (*p_Var7)(&local_a70);
                              auVar203 = ZEXT1664(local_ae0._0_16_);
                              auVar266 = ZEXT3264(local_8a0);
                              auVar257 = ZEXT3264(local_880);
                              auVar253 = ZEXT3264(local_860);
                              fVar146 = (float)local_aa0._0_4_;
                              fVar114 = (float)local_ac0._0_4_;
                              uVar81 = local_ac0._4_4_;
                              uVar276 = local_ac0._8_4_;
                              uVar277 = local_ac0._12_4_;
                            }
                            if (*local_a70.valid == 0) goto LAB_016897b9;
                          }
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a70.hit;
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a70.hit + 4);
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a70.hit + 8);
                          *(float *)((long)local_a70.ray + 0x3c) = *(float *)(local_a70.hit + 0xc);
                          *(float *)((long)local_a70.ray + 0x40) = *(float *)(local_a70.hit + 0x10);
                          *(float *)((long)local_a70.ray + 0x44) = *(float *)(local_a70.hit + 0x14);
                          *(float *)((long)local_a70.ray + 0x48) = *(float *)(local_a70.hit + 0x18);
                          *(float *)((long)local_a70.ray + 0x4c) = *(float *)(local_a70.hit + 0x1c);
                          *(float *)((long)local_a70.ray + 0x50) = *(float *)(local_a70.hit + 0x20);
                        }
                        else {
                          auVar225 = ZEXT1664(auVar218);
                          auVar237 = ZEXT1664(local_940._0_16_);
                          auVar246 = ZEXT1664(local_920._0_16_);
                          (*pGVar5->intersectionFilterN)(&local_a70);
                          auVar203 = ZEXT1664(local_ae0._0_16_);
                          auVar266 = ZEXT3264(local_8a0);
                          auVar257 = ZEXT3264(local_880);
                          auVar253 = ZEXT3264(local_860);
                          fVar146 = (float)local_aa0._0_4_;
                          fVar114 = (float)local_ac0._0_4_;
                          uVar81 = local_ac0._4_4_;
                          uVar276 = local_ac0._8_4_;
                          uVar277 = local_ac0._12_4_;
                          if (*local_a70.valid != 0) goto LAB_016896ef;
LAB_016897b9:
                          (ray->super_RayK<1>).tfar = fVar146;
                        }
                      }
                    }
                  }
                }
                auVar108 = local_5e0;
                bVar84 = lVar83 != 0;
                lVar83 = lVar83 + -1;
              } while ((!bVar49) && (bVar84));
              fVar114 = (ray->super_RayK<1>).tfar;
              auVar109._4_4_ = fVar114;
              auVar109._0_4_ = fVar114;
              auVar109._8_4_ = fVar114;
              auVar109._12_4_ = fVar114;
              auVar109._16_4_ = fVar114;
              auVar109._20_4_ = fVar114;
              auVar109._24_4_ = fVar114;
              auVar109._28_4_ = fVar114;
              auVar65._4_4_ = fStack_55c;
              auVar65._0_4_ = local_560;
              auVar65._8_4_ = fStack_558;
              auVar65._12_4_ = fStack_554;
              auVar65._16_4_ = fStack_550;
              auVar65._20_4_ = fStack_54c;
              auVar65._24_4_ = fStack_548;
              auVar65._28_4_ = fStack_544;
              auVar144 = vcmpps_avx(auVar65,auVar109,2);
              local_5e0 = vandps_avx(auVar144,local_5e0);
              auVar203 = ZEXT3264(local_5e0);
              auVar108 = auVar108 & auVar144;
              uVar82 = local_680._0_8_;
            } while ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar108 >> 0x7f,0) != '\0') ||
                       (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar108 >> 0xbf,0) != '\0') ||
                     (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar108[0x1f] < '\0');
          }
          auVar113._0_4_ = auVar266._0_4_ * (float)local_6c0._0_4_;
          auVar113._4_4_ = auVar266._4_4_ * (float)local_6c0._4_4_;
          auVar113._8_4_ = auVar266._8_4_ * fStack_6b8;
          auVar113._12_4_ = auVar266._12_4_ * fStack_6b4;
          auVar113._16_4_ = auVar266._16_4_ * fStack_6b0;
          auVar113._20_4_ = auVar266._20_4_ * fStack_6ac;
          auVar113._28_36_ = auVar203._28_36_;
          auVar113._24_4_ = auVar266._24_4_ * fStack_6a8;
          auVar96 = vfmadd213ps_fma(local_6a0,auVar257._0_32_,auVar113._0_32_);
          auVar96 = vfmadd213ps_fma(local_460,auVar253._0_32_,ZEXT1632(auVar96));
          auVar64._4_4_ = uStack_77c;
          auVar64._0_4_ = local_780;
          auVar64._8_4_ = uStack_778;
          auVar64._12_4_ = uStack_774;
          auVar64._16_4_ = uStack_770;
          auVar64._20_4_ = uStack_76c;
          auVar64._24_4_ = uStack_768;
          auVar64._28_4_ = uStack_764;
          auVar108 = vandps_avx(ZEXT1632(auVar96),auVar64);
          auVar138._8_4_ = 0x3e99999a;
          auVar138._0_8_ = 0x3e99999a3e99999a;
          auVar138._12_4_ = 0x3e99999a;
          auVar138._16_4_ = 0x3e99999a;
          auVar138._20_4_ = 0x3e99999a;
          auVar138._24_4_ = 0x3e99999a;
          auVar138._28_4_ = 0x3e99999a;
          auVar108 = vcmpps_avx(auVar108,auVar138,1);
          auVar144 = vorps_avx(auVar108,local_3c0);
          auVar139._0_4_ = (float)local_5c0._0_4_ + (float)local_740._0_4_;
          auVar139._4_4_ = (float)local_5c0._4_4_ + (float)local_740._4_4_;
          auVar139._8_4_ = fStack_5b8 + fStack_738;
          auVar139._12_4_ = fStack_5b4 + fStack_734;
          auVar139._16_4_ = fStack_5b0 + fStack_730;
          auVar139._20_4_ = fStack_5ac + fStack_72c;
          auVar139._24_4_ = fStack_5a8 + fStack_728;
          auVar139._28_4_ = fStack_5a4 + fStack_724;
          fVar114 = (ray->super_RayK<1>).tfar;
          auVar160._4_4_ = fVar114;
          auVar160._0_4_ = fVar114;
          auVar160._8_4_ = fVar114;
          auVar160._12_4_ = fVar114;
          auVar160._16_4_ = fVar114;
          auVar160._20_4_ = fVar114;
          auVar160._24_4_ = fVar114;
          auVar160._28_4_ = fVar114;
          auVar108 = vcmpps_avx(auVar139,auVar160,2);
          local_720 = vandps_avx(auVar108,local_3a0);
          auVar140._8_4_ = 3;
          auVar140._0_8_ = 0x300000003;
          auVar140._12_4_ = 3;
          auVar140._16_4_ = 3;
          auVar140._20_4_ = 3;
          auVar140._24_4_ = 3;
          auVar140._28_4_ = 3;
          auVar161._8_4_ = 2;
          auVar161._0_8_ = 0x200000002;
          auVar161._12_4_ = 2;
          auVar161._16_4_ = 2;
          auVar161._20_4_ = 2;
          auVar161._24_4_ = 2;
          auVar161._28_4_ = 2;
          auVar108 = vblendvps_avx(auVar161,auVar140,auVar144);
          local_760 = vpcmpgtd_avx2(auVar108,local_3e0);
          local_600 = vpandn_avx2(local_760,local_720);
          auVar108 = local_720 & ~local_760;
          if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar108 >> 0x7f,0) != '\0') ||
                (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar108 >> 0xbf,0) != '\0') ||
              (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar108[0x1f] < '\0') {
            auVar194 = vminps_avx(local_a10,local_a30);
            auVar96 = vmaxps_avx(local_a10,local_a30);
            auVar218 = vminps_avx(local_a20,_local_a40);
            auVar124 = vminps_avx(auVar194,auVar218);
            auVar194 = vmaxps_avx(local_a20,_local_a40);
            auVar218 = vmaxps_avx(auVar96,auVar194);
            auVar96 = vandps_avx(auVar124,local_8b0);
            auVar194 = vandps_avx(auVar218,local_8b0);
            auVar96 = vmaxps_avx(auVar96,auVar194);
            auVar194 = vmovshdup_avx(auVar96);
            auVar194 = vmaxss_avx(auVar194,auVar96);
            auVar96 = vshufpd_avx(auVar96,auVar96,1);
            auVar96 = vmaxss_avx(auVar96,auVar194);
            local_7e0._0_4_ = auVar96._0_4_ * 1.9073486e-06;
            local_8a0._0_16_ = vshufps_avx(auVar218,auVar218,0xff);
            local_6e0 = _local_4e0;
            local_700._4_4_ = (float)local_4e0._4_4_ + (float)local_740._4_4_;
            local_700._0_4_ = (float)local_4e0._0_4_ + (float)local_740._0_4_;
            fStack_6f8 = fStack_4d8 + fStack_738;
            fStack_6f4 = fStack_4d4 + fStack_734;
            fStack_6f0 = fStack_4d0 + fStack_730;
            fStack_6ec = fStack_4cc + fStack_72c;
            fStack_6e8 = fStack_4c8 + fStack_728;
            fStack_6e4 = fStack_4c4 + fStack_724;
            do {
              auVar141._8_4_ = 0x7f800000;
              auVar141._0_8_ = 0x7f8000007f800000;
              auVar141._12_4_ = 0x7f800000;
              auVar141._16_4_ = 0x7f800000;
              auVar141._20_4_ = 0x7f800000;
              auVar141._24_4_ = 0x7f800000;
              auVar141._28_4_ = 0x7f800000;
              auVar108 = vblendvps_avx(auVar141,local_6e0,local_600);
              auVar144 = vshufps_avx(auVar108,auVar108,0xb1);
              auVar144 = vminps_avx(auVar108,auVar144);
              auVar100 = vshufpd_avx(auVar144,auVar144,5);
              auVar144 = vminps_avx(auVar144,auVar100);
              auVar100 = vpermpd_avx2(auVar144,0x4e);
              auVar144 = vminps_avx(auVar144,auVar100);
              auVar144 = vcmpps_avx(auVar108,auVar144,0);
              auVar100 = local_600 & auVar144;
              auVar108 = local_600;
              if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar100 >> 0x7f,0) != '\0') ||
                    (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar100 >> 0xbf,0) != '\0') ||
                  (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar100[0x1f] < '\0') {
                auVar108 = vandps_avx(auVar144,local_600);
              }
              uVar78 = vmovmskps_avx(auVar108);
              iVar13 = 0;
              for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                iVar13 = iVar13 + 1;
              }
              uVar78 = iVar13 << 2;
              *(undefined4 *)(local_600 + uVar78) = 0;
              aVar2 = (ray->super_RayK<1>).dir.field_0;
              _local_8e0 = (undefined1  [16])aVar2;
              auVar96 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              auVar203 = ZEXT464(*(uint *)(local_540 + uVar78));
              auVar237 = ZEXT464(*(uint *)(local_4c0 + uVar78));
              if (auVar96._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_540 + uVar78));
                local_ac0._0_16_ = ZEXT416(*(uint *)(local_4c0 + uVar78));
                fVar114 = sqrtf(auVar96._0_4_);
                auVar237 = ZEXT1664(local_ac0._0_16_);
                auVar203 = ZEXT1664(local_ae0._0_16_);
              }
              else {
                auVar96 = vsqrtss_avx(auVar96,auVar96);
                fVar114 = auVar96._0_4_;
              }
              local_920._0_4_ = fVar114 * 1.9073486e-06;
              lVar83 = 4;
              do {
                fVar85 = auVar203._0_4_;
                fVar114 = 1.0 - fVar85;
                local_900._0_16_ = ZEXT416((uint)fVar114);
                auVar127._0_4_ = local_a30._0_4_ * fVar85;
                auVar127._4_4_ = local_a30._4_4_ * fVar85;
                auVar127._8_4_ = local_a30._8_4_ * fVar85;
                auVar127._12_4_ = local_a30._12_4_ * fVar85;
                auVar154._4_4_ = fVar114;
                auVar154._0_4_ = fVar114;
                auVar154._8_4_ = fVar114;
                auVar154._12_4_ = fVar114;
                auVar96 = vfmadd231ps_fma(auVar127,auVar154,local_a10);
                auVar174._0_4_ = local_a20._0_4_ * fVar85;
                auVar174._4_4_ = local_a20._4_4_ * fVar85;
                auVar174._8_4_ = local_a20._8_4_ * fVar85;
                auVar174._12_4_ = local_a20._12_4_ * fVar85;
                auVar194 = vfmadd231ps_fma(auVar174,auVar154,local_a30);
                auVar217._0_4_ = fVar85 * auVar194._0_4_;
                auVar217._4_4_ = fVar85 * auVar194._4_4_;
                auVar217._8_4_ = fVar85 * auVar194._8_4_;
                auVar217._12_4_ = fVar85 * auVar194._12_4_;
                auVar218 = vfmadd231ps_fma(auVar217,auVar154,auVar96);
                auVar128._0_4_ = fVar85 * (float)local_a40._0_4_;
                auVar128._4_4_ = fVar85 * (float)local_a40._4_4_;
                auVar128._8_4_ = fVar85 * fStack_a38;
                auVar128._12_4_ = fVar85 * fStack_a34;
                auVar96 = vfmadd231ps_fma(auVar128,auVar154,local_a20);
                auVar196._0_4_ = fVar85 * auVar96._0_4_;
                auVar196._4_4_ = fVar85 * auVar96._4_4_;
                auVar196._8_4_ = fVar85 * auVar96._8_4_;
                auVar196._12_4_ = fVar85 * auVar96._12_4_;
                auVar194 = vfmadd231ps_fma(auVar196,auVar154,auVar194);
                uVar81 = auVar237._0_4_;
                auVar129._4_4_ = uVar81;
                auVar129._0_4_ = uVar81;
                auVar129._8_4_ = uVar81;
                auVar129._12_4_ = uVar81;
                auVar96 = vfmadd213ps_fma(auVar129,_local_8e0,_DAT_01feba10);
                auVar95._0_4_ = fVar85 * auVar194._0_4_;
                auVar95._4_4_ = fVar85 * auVar194._4_4_;
                auVar95._8_4_ = fVar85 * auVar194._8_4_;
                auVar95._12_4_ = fVar85 * auVar194._12_4_;
                auVar124 = vfmadd231ps_fma(auVar95,auVar218,auVar154);
                local_820._0_16_ = auVar124;
                auVar96 = vsubps_avx(auVar96,auVar124);
                _local_9c0 = auVar96;
                auVar96 = vdpps_avx(auVar96,auVar96,0x7f);
                local_ae0._0_16_ = auVar203._0_16_;
                local_ac0._0_16_ = auVar237._0_16_;
                local_aa0._0_16_ = auVar96;
                if (auVar96._0_4_ < 0.0) {
                  local_900._0_16_ = ZEXT416((uint)fVar114);
                  local_840._0_16_ = auVar218;
                  local_9e0._0_16_ = auVar194;
                  auVar225._0_4_ = sqrtf(auVar96._0_4_);
                  auVar225._4_60_ = extraout_var_00;
                  auVar237 = ZEXT1664(local_ac0._0_16_);
                  auVar96 = auVar225._0_16_;
                  auVar194 = local_9e0._0_16_;
                  auVar218 = local_840._0_16_;
                  auVar124 = local_ae0._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar96,auVar96);
                  auVar124 = auVar203._0_16_;
                }
                auVar194 = vsubps_avx(auVar194,auVar218);
                auVar240._0_4_ = auVar194._0_4_ * 3.0;
                auVar240._4_4_ = auVar194._4_4_ * 3.0;
                auVar240._8_4_ = auVar194._8_4_ * 3.0;
                auVar240._12_4_ = auVar194._12_4_ * 3.0;
                auVar194 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_900._0_16_,auVar124)
                ;
                auVar218 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar124,local_900._0_16_)
                ;
                fVar114 = local_900._0_4_ * 6.0;
                fVar85 = auVar194._0_4_ * 6.0;
                fVar146 = auVar218._0_4_ * 6.0;
                fVar247 = auVar124._0_4_ * 6.0;
                auVar175._0_4_ = fVar247 * (float)local_a40._0_4_;
                auVar175._4_4_ = fVar247 * (float)local_a40._4_4_;
                auVar175._8_4_ = fVar247 * fStack_a38;
                auVar175._12_4_ = fVar247 * fStack_a34;
                auVar130._4_4_ = fVar146;
                auVar130._0_4_ = fVar146;
                auVar130._8_4_ = fVar146;
                auVar130._12_4_ = fVar146;
                auVar194 = vfmadd132ps_fma(auVar130,auVar175,local_a20);
                auVar176._4_4_ = fVar85;
                auVar176._0_4_ = fVar85;
                auVar176._8_4_ = fVar85;
                auVar176._12_4_ = fVar85;
                auVar194 = vfmadd132ps_fma(auVar176,auVar194,local_a30);
                auVar218 = vdpps_avx(auVar240,auVar240,0x7f);
                auVar131._4_4_ = fVar114;
                auVar131._0_4_ = fVar114;
                auVar131._8_4_ = fVar114;
                auVar131._12_4_ = fVar114;
                auVar9 = vfmadd132ps_fma(auVar131,auVar194,local_a10);
                auVar194 = vblendps_avx(auVar218,_DAT_01feba10,0xe);
                auVar124 = vrsqrtss_avx(auVar194,auVar194);
                fVar146 = auVar218._0_4_;
                fVar114 = auVar124._0_4_;
                auVar124 = vdpps_avx(auVar240,auVar9,0x7f);
                fVar114 = fVar114 * 1.5 + fVar146 * -0.5 * fVar114 * fVar114 * fVar114;
                auVar132._0_4_ = auVar9._0_4_ * fVar146;
                auVar132._4_4_ = auVar9._4_4_ * fVar146;
                auVar132._8_4_ = auVar9._8_4_ * fVar146;
                auVar132._12_4_ = auVar9._12_4_ * fVar146;
                fVar85 = auVar124._0_4_;
                auVar219._0_4_ = auVar240._0_4_ * fVar85;
                auVar219._4_4_ = auVar240._4_4_ * fVar85;
                auVar219._8_4_ = auVar240._8_4_ * fVar85;
                auVar219._12_4_ = auVar240._12_4_ * fVar85;
                auVar124 = vsubps_avx(auVar132,auVar219);
                auVar194 = vrcpss_avx(auVar194,auVar194);
                auVar9 = vfnmadd213ss_fma(auVar194,auVar218,ZEXT416(0x40000000));
                fVar85 = auVar194._0_4_ * auVar9._0_4_;
                auVar194 = vmaxss_avx(ZEXT416((uint)local_7e0._0_4_),
                                      ZEXT416((uint)(auVar237._0_4_ * (float)local_920._0_4_)));
                auVar257 = ZEXT1664(auVar194);
                uVar82 = CONCAT44(auVar240._4_4_,auVar240._0_4_);
                auVar226._0_8_ = uVar82 ^ 0x8000000080000000;
                auVar226._8_4_ = -auVar240._8_4_;
                auVar226._12_4_ = -auVar240._12_4_;
                auVar177._0_4_ = fVar114 * auVar124._0_4_ * fVar85;
                auVar177._4_4_ = fVar114 * auVar124._4_4_ * fVar85;
                auVar177._8_4_ = fVar114 * auVar124._8_4_ * fVar85;
                auVar177._12_4_ = fVar114 * auVar124._12_4_ * fVar85;
                auVar234._0_4_ = auVar240._0_4_ * fVar114;
                auVar234._4_4_ = auVar240._4_4_ * fVar114;
                auVar234._8_4_ = auVar240._8_4_ * fVar114;
                auVar234._12_4_ = auVar240._12_4_ * fVar114;
                local_900._0_16_ = auVar240;
                local_840._0_4_ = auVar194._0_4_;
                if (fVar146 < -fVar146) {
                  local_9e0._0_4_ = auVar96._0_4_;
                  local_940._0_16_ = auVar226;
                  local_a00._0_16_ = auVar234;
                  local_800._0_16_ = auVar177;
                  fVar114 = sqrtf(fVar146);
                  auVar96 = ZEXT416((uint)local_9e0._0_4_);
                  auVar257 = ZEXT464((uint)local_840._0_4_);
                  auVar177 = local_800._0_16_;
                  auVar226 = local_940._0_16_;
                  auVar234 = local_a00._0_16_;
                }
                else {
                  auVar194 = vsqrtss_avx(auVar218,auVar218);
                  fVar114 = auVar194._0_4_;
                }
                auVar194 = vdpps_avx(_local_9c0,auVar234,0x7f);
                auVar272 = vfmadd213ss_fma(ZEXT416((uint)local_7e0._0_4_),auVar96,auVar257._0_16_);
                auVar218 = vdpps_avx(auVar226,auVar234,0x7f);
                auVar124 = vdpps_avx(_local_9c0,auVar177,0x7f);
                auVar9 = vdpps_avx(_local_8e0,auVar234,0x7f);
                auVar272 = vfmadd213ss_fma(ZEXT416((uint)(auVar96._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_7e0._0_4_ / fVar114)),
                                           auVar272);
                auVar266 = ZEXT1664(auVar272);
                fVar114 = auVar218._0_4_ + auVar124._0_4_;
                auVar97._0_4_ = auVar194._0_4_ * auVar194._0_4_;
                auVar97._4_4_ = auVar194._4_4_ * auVar194._4_4_;
                auVar97._8_4_ = auVar194._8_4_ * auVar194._8_4_;
                auVar97._12_4_ = auVar194._12_4_ * auVar194._12_4_;
                auVar96 = vdpps_avx(_local_9c0,auVar226,0x7f);
                auVar124 = vsubps_avx(local_aa0._0_16_,auVar97);
                auVar218 = vrsqrtss_avx(auVar124,auVar124);
                fVar146 = auVar124._0_4_;
                fVar85 = auVar218._0_4_;
                fVar85 = fVar85 * 1.5 + fVar146 * -0.5 * fVar85 * fVar85 * fVar85;
                auVar218 = vdpps_avx(_local_9c0,_local_8e0,0x7f);
                auVar96 = vfnmadd231ss_fma(auVar96,auVar194,ZEXT416((uint)fVar114));
                auVar218 = vfnmadd231ss_fma(auVar218,auVar194,auVar9);
                if (fVar146 < 0.0) {
                  local_9e0._0_16_ = auVar194;
                  local_940._0_4_ = auVar272._0_4_;
                  local_a00._0_16_ = ZEXT416((uint)fVar114);
                  local_800._0_16_ = auVar9;
                  local_960._0_16_ = auVar96;
                  local_860._0_4_ = fVar85;
                  local_880._0_16_ = auVar218;
                  fVar146 = sqrtf(fVar146);
                  auVar266 = ZEXT464((uint)local_940._0_4_);
                  auVar257 = ZEXT464((uint)local_840._0_4_);
                  fVar85 = (float)local_860._0_4_;
                  auVar218 = local_880._0_16_;
                  auVar124 = local_aa0._0_16_;
                  auVar194 = local_9e0._0_16_;
                  auVar9 = local_800._0_16_;
                  auVar96 = local_960._0_16_;
                  auVar272 = local_a00._0_16_;
                }
                else {
                  auVar124 = vsqrtss_avx(auVar124,auVar124);
                  fVar146 = auVar124._0_4_;
                  auVar124 = local_aa0._0_16_;
                  auVar272 = ZEXT416((uint)fVar114);
                }
                auVar253 = ZEXT1664(auVar124);
                auVar246 = ZEXT1664(local_900._0_16_);
                auVar88 = vpermilps_avx(local_820._0_16_,0xff);
                auVar89 = vshufps_avx(local_900._0_16_,local_900._0_16_,0xff);
                auVar96 = vfmsub213ss_fma(auVar96,ZEXT416((uint)fVar85),auVar89);
                auVar178._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
                auVar178._8_4_ = auVar9._8_4_ ^ 0x80000000;
                auVar178._12_4_ = auVar9._12_4_ ^ 0x80000000;
                auVar197._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
                auVar197._8_4_ = auVar96._8_4_ ^ 0x80000000;
                auVar197._12_4_ = auVar96._12_4_ ^ 0x80000000;
                auVar155 = ZEXT416((uint)(auVar218._0_4_ * fVar85));
                auVar218 = vfmsub231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar96._0_4_)),auVar272,
                                           auVar155);
                auVar96 = vinsertps_avx(auVar155,auVar178,0x10);
                uVar81 = auVar218._0_4_;
                auVar179._4_4_ = uVar81;
                auVar179._0_4_ = uVar81;
                auVar179._8_4_ = uVar81;
                auVar179._12_4_ = uVar81;
                auVar96 = vdivps_avx(auVar96,auVar179);
                auVar88 = ZEXT416((uint)(fVar146 - auVar88._0_4_));
                auVar9 = vinsertps_avx(auVar194,auVar88,0x10);
                auVar225 = ZEXT1664(auVar9);
                auVar156._0_4_ = auVar9._0_4_ * auVar96._0_4_;
                auVar156._4_4_ = auVar9._4_4_ * auVar96._4_4_;
                auVar156._8_4_ = auVar9._8_4_ * auVar96._8_4_;
                auVar156._12_4_ = auVar9._12_4_ * auVar96._12_4_;
                auVar96 = vinsertps_avx(auVar197,auVar272,0x1c);
                auVar96 = vdivps_avx(auVar96,auVar179);
                auVar180._0_4_ = auVar9._0_4_ * auVar96._0_4_;
                auVar180._4_4_ = auVar9._4_4_ * auVar96._4_4_;
                auVar180._8_4_ = auVar9._8_4_ * auVar96._8_4_;
                auVar180._12_4_ = auVar9._12_4_ * auVar96._12_4_;
                auVar96 = vhaddps_avx(auVar156,auVar156);
                auVar218 = vhaddps_avx(auVar180,auVar180);
                fVar85 = (float)local_ae0._0_4_ - auVar96._0_4_;
                auVar203 = ZEXT464((uint)fVar85);
                fVar114 = (float)local_ac0._0_4_ - auVar218._0_4_;
                auVar237 = ZEXT464((uint)fVar114);
                auVar96 = vandps_avx(auVar194,local_8b0);
                if (auVar266._0_4_ <= auVar96._0_4_) {
LAB_0168a007:
                  bVar49 = false;
                }
                else {
                  auVar194 = vfmadd231ss_fma(ZEXT416((uint)(auVar257._0_4_ + auVar266._0_4_)),
                                             local_8a0._0_16_,ZEXT416(0x36000000));
                  auVar96 = vandps_avx(auVar88,local_8b0);
                  if (auVar194._0_4_ <= auVar96._0_4_) goto LAB_0168a007;
                  fVar114 = fVar114 + (float)local_7a0._0_4_;
                  auVar237 = ZEXT464((uint)fVar114);
                  bVar49 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar114) &&
                       (fVar146 = (ray->super_RayK<1>).tfar, fVar114 <= fVar146)) && (0.0 <= fVar85)
                      ) && (fVar85 <= 1.0)) {
                    auVar96 = vrsqrtss_avx(auVar124,auVar124);
                    fVar247 = auVar96._0_4_;
                    pGVar5 = (context->scene->geometries).items[local_ae8].ptr;
                    if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar247 = fVar247 * 1.5 + auVar124._0_4_ * -0.5 * fVar247 * fVar247 * fVar247;
                      auVar133._0_4_ = fVar247 * (float)local_9c0._0_4_;
                      auVar133._4_4_ = fVar247 * (float)local_9c0._4_4_;
                      auVar133._8_4_ = fVar247 * fStack_9b8;
                      auVar133._12_4_ = fVar247 * fStack_9b4;
                      auVar272 = vfmadd213ps_fma(auVar89,auVar133,local_900._0_16_);
                      auVar96 = vshufps_avx(auVar133,auVar133,0xc9);
                      auVar194 = vshufps_avx(local_900._0_16_,local_900._0_16_,0xc9);
                      auVar134._0_4_ = auVar133._0_4_ * auVar194._0_4_;
                      auVar134._4_4_ = auVar133._4_4_ * auVar194._4_4_;
                      auVar134._8_4_ = auVar133._8_4_ * auVar194._8_4_;
                      auVar134._12_4_ = auVar133._12_4_ * auVar194._12_4_;
                      auVar218 = vfmsub231ps_fma(auVar134,local_900._0_16_,auVar96);
                      auVar96 = vshufps_avx(auVar218,auVar218,0xc9);
                      auVar194 = vshufps_avx(auVar272,auVar272,0xc9);
                      auVar218 = vshufps_avx(auVar218,auVar218,0xd2);
                      auVar98._0_4_ = auVar272._0_4_ * auVar218._0_4_;
                      auVar98._4_4_ = auVar272._4_4_ * auVar218._4_4_;
                      auVar98._8_4_ = auVar272._8_4_ * auVar218._8_4_;
                      auVar98._12_4_ = auVar272._12_4_ * auVar218._12_4_;
                      auVar96 = vfmsub231ps_fma(auVar98,auVar96,auVar194);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar114;
                        auVar194 = vshufps_avx(auVar96,auVar96,0xe9);
                        uVar1 = vmovlps_avx(auVar194);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar1;
                        (ray->Ng).field_0.field_0.z = auVar96._0_4_;
                        ray->u = fVar85;
                        ray->v = 0.0;
                        ray->primID = (uint)local_a78;
                        ray->geomID = (uint)local_ae8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar194 = vshufps_avx(auVar96,auVar96,0xe9);
                        local_990 = vmovlps_avx(auVar194);
                        local_988 = auVar96._0_4_;
                        local_984 = fVar85;
                        local_980 = 0;
                        local_97c = (uint)local_a78;
                        local_978 = (uint)local_ae8;
                        local_974 = context->user->instID[0];
                        local_970 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar114;
                        local_aec = -1;
                        local_a70.valid = &local_aec;
                        local_a70.geometryUserPtr = pGVar5->userPtr;
                        local_a70.context = context->user;
                        local_a70.ray = (RTCRayN *)ray;
                        local_a70.hit = (RTCHitN *)&local_990;
                        local_a70.N = 1;
                        local_ae0._0_16_ = ZEXT416((uint)fVar85);
                        local_ac0._0_16_ = ZEXT416((uint)fVar114);
                        local_aa0._0_4_ = fVar146;
                        if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0168a131:
                          p_Var7 = context->args->filter;
                          if (p_Var7 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                              auVar225 = ZEXT1664(auVar225._0_16_);
                              auVar246 = ZEXT1664(auVar246._0_16_);
                              auVar253 = ZEXT1664(auVar253._0_16_);
                              auVar257 = ZEXT1664(auVar257._0_16_);
                              auVar266 = ZEXT1664(auVar266._0_16_);
                              (*p_Var7)(&local_a70);
                              auVar237 = ZEXT1664(local_ac0._0_16_);
                              auVar203 = ZEXT1664(local_ae0._0_16_);
                              fVar146 = (float)local_aa0._0_4_;
                            }
                            if (*local_a70.valid == 0) goto LAB_0168a1d7;
                          }
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a70.hit;
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a70.hit + 4);
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a70.hit + 8);
                          *(float *)((long)local_a70.ray + 0x3c) = *(float *)(local_a70.hit + 0xc);
                          *(float *)((long)local_a70.ray + 0x40) = *(float *)(local_a70.hit + 0x10);
                          *(float *)((long)local_a70.ray + 0x44) = *(float *)(local_a70.hit + 0x14);
                          *(float *)((long)local_a70.ray + 0x48) = *(float *)(local_a70.hit + 0x18);
                          *(float *)((long)local_a70.ray + 0x4c) = *(float *)(local_a70.hit + 0x1c);
                          *(float *)((long)local_a70.ray + 0x50) = *(float *)(local_a70.hit + 0x20);
                        }
                        else {
                          auVar225 = ZEXT1664(auVar9);
                          auVar246 = ZEXT1664(local_900._0_16_);
                          auVar253 = ZEXT1664(auVar124);
                          auVar257 = ZEXT1664(auVar257._0_16_);
                          auVar266 = ZEXT1664(auVar266._0_16_);
                          (*pGVar5->intersectionFilterN)(&local_a70);
                          auVar237 = ZEXT1664(local_ac0._0_16_);
                          auVar203 = ZEXT1664(local_ae0._0_16_);
                          fVar146 = (float)local_aa0._0_4_;
                          if (*local_a70.valid != 0) goto LAB_0168a131;
LAB_0168a1d7:
                          (ray->super_RayK<1>).tfar = fVar146;
                        }
                      }
                    }
                  }
                }
                auVar108 = local_600;
                bVar84 = lVar83 != 0;
                lVar83 = lVar83 + -1;
              } while ((!bVar49) && (bVar84));
              fVar114 = (ray->super_RayK<1>).tfar;
              auVar110._4_4_ = fVar114;
              auVar110._0_4_ = fVar114;
              auVar110._8_4_ = fVar114;
              auVar110._12_4_ = fVar114;
              auVar110._16_4_ = fVar114;
              auVar110._20_4_ = fVar114;
              auVar110._24_4_ = fVar114;
              auVar110._28_4_ = fVar114;
              auVar144 = vcmpps_avx(_local_700,auVar110,2);
              local_600 = vandps_avx(auVar144,local_600);
              auVar108 = auVar108 & auVar144;
              uVar82 = local_680._0_8_;
            } while ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar108 >> 0x7f,0) != '\0') ||
                       (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar108 >> 0xbf,0) != '\0') ||
                     (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar108[0x1f] < '\0');
          }
          auVar142._0_4_ = (float)local_740._0_4_ + local_4a0._0_4_;
          auVar142._4_4_ = (float)local_740._4_4_ + local_4a0._4_4_;
          auVar142._8_4_ = fStack_738 + local_4a0._8_4_;
          auVar142._12_4_ = fStack_734 + local_4a0._12_4_;
          auVar142._16_4_ = fStack_730 + local_4a0._16_4_;
          auVar142._20_4_ = fStack_72c + local_4a0._20_4_;
          auVar142._24_4_ = fStack_728 + local_4a0._24_4_;
          auVar142._28_4_ = fStack_724 + local_4a0._28_4_;
          fVar114 = (ray->super_RayK<1>).tfar;
          auVar188._4_4_ = fVar114;
          auVar188._0_4_ = fVar114;
          auVar188._8_4_ = fVar114;
          auVar188._12_4_ = fVar114;
          auVar188._16_4_ = fVar114;
          auVar188._20_4_ = fVar114;
          auVar188._24_4_ = fVar114;
          auVar188._28_4_ = fVar114;
          auVar144 = vcmpps_avx(auVar142,auVar188,2);
          auVar108 = vandps_avx(local_5a0,local_580);
          auVar108 = vandps_avx(auVar144,auVar108);
          auVar202._0_4_ = (float)local_740._0_4_ + local_4e0._0_4_;
          auVar202._4_4_ = (float)local_740._4_4_ + local_4e0._4_4_;
          auVar202._8_4_ = fStack_738 + local_4e0._8_4_;
          auVar202._12_4_ = fStack_734 + local_4e0._12_4_;
          auVar202._16_4_ = fStack_730 + local_4e0._16_4_;
          auVar202._20_4_ = fStack_72c + local_4e0._20_4_;
          auVar202._24_4_ = fStack_728 + local_4e0._24_4_;
          auVar202._28_4_ = fStack_724 + local_4e0._28_4_;
          auVar100 = vcmpps_avx(auVar202,auVar188,2);
          auVar144 = vandps_avx(local_760,local_720);
          auVar144 = vandps_avx(auVar100,auVar144);
          auVar144 = vorps_avx(auVar108,auVar144);
          if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar144 >> 0x7f,0) != '\0') ||
                (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar144 >> 0xbf,0) != '\0') ||
              (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar144[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar79 * 0x60) = auVar144;
            auVar108 = vblendvps_avx(_local_4e0,local_4a0,auVar108);
            *(undefined1 (*) [32])(auStack_160 + uVar79 * 0x60) = auVar108;
            auVar59._8_8_ = uStack_7a8;
            auVar59._0_8_ = local_7b0;
            uVar1 = vmovlps_avx(auVar59);
            *(undefined8 *)(afStack_140 + uVar79 * 0x18) = uVar1;
            auStack_138[uVar79 * 0x18] = (int)uVar82 + 1;
            uVar79 = (ulong)((int)uVar79 + 1);
          }
        }
      }
    }
    fVar114 = (ray->super_RayK<1>).tfar;
    auVar111._4_4_ = fVar114;
    auVar111._0_4_ = fVar114;
    auVar111._8_4_ = fVar114;
    auVar111._12_4_ = fVar114;
    auVar111._16_4_ = fVar114;
    auVar111._20_4_ = fVar114;
    auVar111._24_4_ = fVar114;
    auVar111._28_4_ = fVar114;
    do {
      if ((int)uVar79 == 0) {
        fVar114 = (ray->super_RayK<1>).tfar;
        auVar99._4_4_ = fVar114;
        auVar99._0_4_ = fVar114;
        auVar99._8_4_ = fVar114;
        auVar99._12_4_ = fVar114;
        auVar96 = vcmpps_avx(local_4f0,auVar99,2);
        uVar78 = vmovmskps_avx(auVar96);
        uVar78 = uVar78 & (uint)local_788 - 1 & (uint)local_788;
        if (uVar78 == 0) {
          return;
        }
        goto LAB_01687f9f;
      }
      uVar80 = (ulong)((int)uVar79 - 1);
      lVar83 = uVar80 * 0x60;
      auVar108 = *(undefined1 (*) [32])(auStack_160 + lVar83);
      auVar143._0_4_ = auVar108._0_4_ + (float)local_740._0_4_;
      auVar143._4_4_ = auVar108._4_4_ + (float)local_740._4_4_;
      auVar143._8_4_ = auVar108._8_4_ + fStack_738;
      auVar143._12_4_ = auVar108._12_4_ + fStack_734;
      auVar143._16_4_ = auVar108._16_4_ + fStack_730;
      auVar143._20_4_ = auVar108._20_4_ + fStack_72c;
      auVar143._24_4_ = auVar108._24_4_ + fStack_728;
      auVar143._28_4_ = auVar108._28_4_ + fStack_724;
      auVar100 = vcmpps_avx(auVar143,auVar111,2);
      auVar144 = vandps_avx(auVar100,*(undefined1 (*) [32])(auStack_180 + lVar83));
      local_4a0 = auVar144;
      auVar12 = *(undefined1 (*) [32])(auStack_180 + lVar83) & auVar100;
      bVar56 = (auVar12 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar57 = (auVar12 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar55 = (auVar12 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar54 = SUB321(auVar12 >> 0x7f,0) == '\0';
      bVar53 = (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar52 = SUB321(auVar12 >> 0xbf,0) == '\0';
      bVar84 = (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar49 = -1 < auVar12[0x1f];
      if (((((((!bVar56 || !bVar57) || !bVar55) || !bVar54) || !bVar53) || !bVar52) || !bVar84) ||
          !bVar49) {
        auVar189._8_4_ = 0x7f800000;
        auVar189._0_8_ = 0x7f8000007f800000;
        auVar189._12_4_ = 0x7f800000;
        auVar189._16_4_ = 0x7f800000;
        auVar189._20_4_ = 0x7f800000;
        auVar189._24_4_ = 0x7f800000;
        auVar189._28_4_ = 0x7f800000;
        auVar108 = vblendvps_avx(auVar189,auVar108,auVar144);
        auVar100 = vshufps_avx(auVar108,auVar108,0xb1);
        auVar100 = vminps_avx(auVar108,auVar100);
        auVar12 = vshufpd_avx(auVar100,auVar100,5);
        auVar12 = vminps_avx(auVar100,auVar12);
        auVar100 = vpermpd_avx2(auVar12,0x4e);
        auVar12 = vminps_avx(auVar12,auVar100);
        auVar108 = vcmpps_avx(auVar108,auVar12,0);
        auVar12 = auVar144 & auVar108;
        if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0x7f,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0xbf,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar12[0x1f] < '\0') {
          auVar144 = vandps_avx(auVar108,auVar144);
        }
        fVar114 = afStack_140[uVar80 * 0x18 + 1];
        uVar82 = (ulong)auStack_138[uVar80 * 0x18];
        uVar78 = vmovmskps_avx(auVar144);
        iVar13 = 0;
        for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
          iVar13 = iVar13 + 1;
        }
        fVar85 = afStack_140[uVar80 * 0x18];
        auVar145._4_4_ = fVar85;
        auVar145._0_4_ = fVar85;
        auVar145._8_4_ = fVar85;
        auVar145._12_4_ = fVar85;
        auVar145._16_4_ = fVar85;
        auVar145._20_4_ = fVar85;
        auVar145._24_4_ = fVar85;
        auVar145._28_4_ = fVar85;
        *(undefined4 *)(local_4a0 + (uint)(iVar13 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar83) = local_4a0;
        if ((((((((local_4a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_4a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_4a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_4a0 >> 0x7f,0) != '\0') ||
              (local_4a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_4a0 >> 0xbf,0) != '\0') ||
            (local_4a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_4a0[0x1f] < '\0') {
          uVar80 = uVar79;
        }
        fVar114 = fVar114 - fVar85;
        auVar162._4_4_ = fVar114;
        auVar162._0_4_ = fVar114;
        auVar162._8_4_ = fVar114;
        auVar162._12_4_ = fVar114;
        auVar162._16_4_ = fVar114;
        auVar162._20_4_ = fVar114;
        auVar162._24_4_ = fVar114;
        auVar162._28_4_ = fVar114;
        auVar96 = vfmadd132ps_fma(auVar162,auVar145,_DAT_02020f20);
        _local_4e0 = ZEXT1632(auVar96);
        local_7b0 = *(undefined8 *)(local_4e0 + (uint)(iVar13 << 2));
        uStack_7a8 = 0;
      }
      uVar79 = uVar80;
      auVar203 = ZEXT3264(auVar100);
    } while (((((((bVar56 && bVar57) && bVar55) && bVar54) && bVar53) && bVar52) && bVar84) &&
             bVar49);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }